

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  uint uVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  undefined4 uVar75;
  undefined8 unaff_R13;
  uint uVar76;
  bool bVar77;
  float fVar78;
  float fVar105;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar109;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar114;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar143;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  float fVar142;
  float fVar144;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 ai;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar151 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar161;
  float fVar182;
  float fVar184;
  vint4 ai_2;
  float fVar186;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar162;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar193;
  float fVar215;
  float fVar217;
  undefined1 auVar195 [16];
  float fVar219;
  undefined1 auVar196 [16];
  float fVar194;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  float fVar216;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar224;
  float fVar243;
  float fVar244;
  vint4 bi;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [28];
  float fVar246;
  float fVar247;
  undefined1 auVar233 [32];
  float fVar245;
  float fVar248;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar249;
  float fVar265;
  float fVar268;
  vint4 ai_1;
  float fVar250;
  float fVar251;
  undefined1 auVar254 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar266;
  float fVar269;
  float fVar271;
  float fVar272;
  float fVar275;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar259 [32];
  float fVar267;
  float fVar270;
  float fVar273;
  float fVar276;
  float fVar279;
  float fVar282;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [28];
  float fVar274;
  float fVar277;
  undefined1 auVar258 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar294;
  undefined1 auVar295 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar296 [32];
  float fVar302;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  float fVar305;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar314;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar325;
  float fVar330;
  float fVar331;
  undefined1 auVar326 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  float fVar337;
  float fVar338;
  float fVar343;
  float fVar345;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [16];
  undefined1 auVar360 [28];
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar361 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c48;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float local_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8c8;
  ulong local_8c0;
  undefined1 auStack_8b8 [24];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  undefined1 auStack_6e0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar2 = prim[1];
  uVar69 = (ulong)(byte)PVar2;
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar169 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar161 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar169 = vsubps_avx(auVar169,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar115._0_4_ = fVar161 * auVar169._0_4_;
  auVar115._4_4_ = fVar161 * auVar169._4_4_;
  auVar115._8_4_ = fVar161 * auVar169._8_4_;
  auVar115._12_4_ = fVar161 * auVar169._12_4_;
  auVar285._0_4_ = fVar161 * auVar6._0_4_;
  auVar285._4_4_ = fVar161 * auVar6._4_4_;
  auVar285._8_4_ = fVar161 * auVar6._8_4_;
  auVar285._12_4_ = fVar161 * auVar6._12_4_;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xc + 6)));
  auVar254 = vcvtdq2ps_avx(auVar254);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x12 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x13 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x14 + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar79 = vshufps_avx(auVar285,auVar285,0);
  auVar85 = vshufps_avx(auVar285,auVar285,0x55);
  auVar147 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar161 = auVar147._0_4_;
  fVar193 = auVar147._4_4_;
  fVar182 = auVar147._8_4_;
  fVar215 = auVar147._12_4_;
  fVar294 = auVar85._0_4_;
  fVar299 = auVar85._4_4_;
  fVar300 = auVar85._8_4_;
  fVar301 = auVar85._12_4_;
  fVar184 = auVar79._0_4_;
  fVar217 = auVar79._4_4_;
  fVar186 = auVar79._8_4_;
  fVar219 = auVar79._12_4_;
  auVar326._0_4_ = fVar184 * auVar169._0_4_ + fVar294 * auVar6._0_4_ + fVar161 * auVar117._0_4_;
  auVar326._4_4_ = fVar217 * auVar169._4_4_ + fVar299 * auVar6._4_4_ + fVar193 * auVar117._4_4_;
  auVar326._8_4_ = fVar186 * auVar169._8_4_ + fVar300 * auVar6._8_4_ + fVar182 * auVar117._8_4_;
  auVar326._12_4_ = fVar219 * auVar169._12_4_ + fVar301 * auVar6._12_4_ + fVar215 * auVar117._12_4_;
  auVar339._0_4_ = fVar184 * auVar14._0_4_ + fVar294 * auVar254._0_4_ + auVar15._0_4_ * fVar161;
  auVar339._4_4_ = fVar217 * auVar14._4_4_ + fVar299 * auVar254._4_4_ + auVar15._4_4_ * fVar193;
  auVar339._8_4_ = fVar186 * auVar14._8_4_ + fVar300 * auVar254._8_4_ + auVar15._8_4_ * fVar182;
  auVar339._12_4_ = fVar219 * auVar14._12_4_ + fVar301 * auVar254._12_4_ + auVar15._12_4_ * fVar215;
  auVar286._0_4_ = fVar184 * auVar80._0_4_ + fVar294 * auVar81._0_4_ + auVar116._0_4_ * fVar161;
  auVar286._4_4_ = fVar217 * auVar80._4_4_ + fVar299 * auVar81._4_4_ + auVar116._4_4_ * fVar193;
  auVar286._8_4_ = fVar186 * auVar80._8_4_ + fVar300 * auVar81._8_4_ + auVar116._8_4_ * fVar182;
  auVar286._12_4_ = fVar219 * auVar80._12_4_ + fVar301 * auVar81._12_4_ + auVar116._12_4_ * fVar215;
  auVar79 = vshufps_avx(auVar115,auVar115,0);
  auVar85 = vshufps_avx(auVar115,auVar115,0x55);
  auVar147 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar161 = auVar147._0_4_;
  fVar193 = auVar147._4_4_;
  fVar182 = auVar147._8_4_;
  fVar215 = auVar147._12_4_;
  fVar294 = auVar85._0_4_;
  fVar299 = auVar85._4_4_;
  fVar300 = auVar85._8_4_;
  fVar301 = auVar85._12_4_;
  fVar184 = auVar79._0_4_;
  fVar217 = auVar79._4_4_;
  fVar186 = auVar79._8_4_;
  fVar219 = auVar79._12_4_;
  auVar225._0_4_ = fVar184 * auVar169._0_4_ + fVar294 * auVar6._0_4_ + fVar161 * auVar117._0_4_;
  auVar225._4_4_ = fVar217 * auVar169._4_4_ + fVar299 * auVar6._4_4_ + fVar193 * auVar117._4_4_;
  auVar225._8_4_ = fVar186 * auVar169._8_4_ + fVar300 * auVar6._8_4_ + fVar182 * auVar117._8_4_;
  auVar225._12_4_ = fVar219 * auVar169._12_4_ + fVar301 * auVar6._12_4_ + fVar215 * auVar117._12_4_;
  auVar85._0_4_ = fVar184 * auVar14._0_4_ + auVar15._0_4_ * fVar161 + fVar294 * auVar254._0_4_;
  auVar85._4_4_ = fVar217 * auVar14._4_4_ + auVar15._4_4_ * fVar193 + fVar299 * auVar254._4_4_;
  auVar85._8_4_ = fVar186 * auVar14._8_4_ + auVar15._8_4_ * fVar182 + fVar300 * auVar254._8_4_;
  auVar85._12_4_ = fVar219 * auVar14._12_4_ + auVar15._12_4_ * fVar215 + fVar301 * auVar254._12_4_;
  auVar79._0_4_ = fVar294 * auVar81._0_4_ + auVar116._0_4_ * fVar161 + fVar184 * auVar80._0_4_;
  auVar79._4_4_ = fVar299 * auVar81._4_4_ + auVar116._4_4_ * fVar193 + fVar217 * auVar80._4_4_;
  auVar79._8_4_ = fVar300 * auVar81._8_4_ + auVar116._8_4_ * fVar182 + fVar186 * auVar80._8_4_;
  auVar79._12_4_ = fVar301 * auVar81._12_4_ + auVar116._12_4_ * fVar215 + fVar219 * auVar80._12_4_;
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar169 = vandps_avx(auVar326,auVar252);
  auVar91._8_4_ = 0x219392ef;
  auVar91._0_8_ = 0x219392ef219392ef;
  auVar91._12_4_ = 0x219392ef;
  auVar169 = vcmpps_avx(auVar169,auVar91,1);
  auVar6 = vblendvps_avx(auVar326,auVar91,auVar169);
  auVar169 = vandps_avx(auVar339,auVar252);
  auVar169 = vcmpps_avx(auVar169,auVar91,1);
  auVar117 = vblendvps_avx(auVar339,auVar91,auVar169);
  auVar169 = vandps_avx(auVar286,auVar252);
  auVar169 = vcmpps_avx(auVar169,auVar91,1);
  auVar169 = vblendvps_avx(auVar286,auVar91,auVar169);
  auVar14 = vrcpps_avx(auVar6);
  fVar294 = auVar14._0_4_;
  auVar147._0_4_ = fVar294 * auVar6._0_4_;
  fVar299 = auVar14._4_4_;
  auVar147._4_4_ = fVar299 * auVar6._4_4_;
  fVar300 = auVar14._8_4_;
  auVar147._8_4_ = fVar300 * auVar6._8_4_;
  fVar301 = auVar14._12_4_;
  auVar147._12_4_ = fVar301 * auVar6._12_4_;
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = 0x3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar6 = vsubps_avx(auVar287,auVar147);
  fVar294 = fVar294 + fVar294 * auVar6._0_4_;
  fVar299 = fVar299 + fVar299 * auVar6._4_4_;
  fVar300 = fVar300 + fVar300 * auVar6._8_4_;
  fVar301 = fVar301 + fVar301 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar117);
  fVar161 = auVar6._0_4_;
  auVar87._0_4_ = fVar161 * auVar117._0_4_;
  fVar182 = auVar6._4_4_;
  auVar87._4_4_ = fVar182 * auVar117._4_4_;
  fVar184 = auVar6._8_4_;
  auVar87._8_4_ = fVar184 * auVar117._8_4_;
  fVar186 = auVar6._12_4_;
  auVar87._12_4_ = fVar186 * auVar117._12_4_;
  auVar6 = vsubps_avx(auVar287,auVar87);
  fVar161 = fVar161 + fVar161 * auVar6._0_4_;
  fVar182 = fVar182 + fVar182 * auVar6._4_4_;
  fVar184 = fVar184 + fVar184 * auVar6._8_4_;
  fVar186 = fVar186 + fVar186 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar169);
  fVar193 = auVar6._0_4_;
  auVar195._0_4_ = fVar193 * auVar169._0_4_;
  fVar215 = auVar6._4_4_;
  auVar195._4_4_ = fVar215 * auVar169._4_4_;
  fVar217 = auVar6._8_4_;
  auVar195._8_4_ = fVar217 * auVar169._8_4_;
  fVar219 = auVar6._12_4_;
  auVar195._12_4_ = fVar219 * auVar169._12_4_;
  auVar6 = vsubps_avx(auVar287,auVar195);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar169 = vpmovsxwd_avx(auVar169);
  fVar193 = fVar193 + fVar193 * auVar6._0_4_;
  fVar215 = fVar215 + fVar215 * auVar6._4_4_;
  fVar217 = fVar217 + fVar217 * auVar6._8_4_;
  fVar219 = fVar219 + fVar219 * auVar6._12_4_;
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar225);
  auVar145._0_4_ = fVar294 * auVar169._0_4_;
  auVar145._4_4_ = fVar299 * auVar169._4_4_;
  auVar145._8_4_ = fVar300 * auVar169._8_4_;
  auVar145._12_4_ = fVar301 * auVar169._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar169 = vpmovsxwd_avx(auVar6);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar6 = vsubps_avx(auVar169,auVar225);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar69 * 0xe + 6);
  auVar169 = vpmovsxwd_avx(auVar117);
  auVar226._0_4_ = fVar294 * auVar6._0_4_;
  auVar226._4_4_ = fVar299 * auVar6._4_4_;
  auVar226._8_4_ = fVar300 * auVar6._8_4_;
  auVar226._12_4_ = fVar301 * auVar6._12_4_;
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar85);
  auVar253._0_4_ = auVar169._0_4_ * fVar161;
  auVar253._4_4_ = auVar169._4_4_ * fVar182;
  auVar253._8_4_ = auVar169._8_4_ * fVar184;
  auVar253._12_4_ = auVar169._12_4_ * fVar186;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar169 = vpmovsxwd_avx(auVar14);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar85);
  auVar116._0_4_ = fVar161 * auVar169._0_4_;
  auVar116._4_4_ = fVar182 * auVar169._4_4_;
  auVar116._8_4_ = fVar184 * auVar169._8_4_;
  auVar116._12_4_ = fVar186 * auVar169._12_4_;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar69 * 0x15 + 6);
  auVar169 = vpmovsxwd_avx(auVar254);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar6 = vsubps_avx(auVar169,auVar79);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar169 = vpmovsxwd_avx(auVar15);
  auVar163._0_4_ = auVar6._0_4_ * fVar193;
  auVar163._4_4_ = auVar6._4_4_ * fVar215;
  auVar163._8_4_ = auVar6._8_4_ * fVar217;
  auVar163._12_4_ = auVar6._12_4_ * fVar219;
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar79);
  auVar80._0_4_ = auVar169._0_4_ * fVar193;
  auVar80._4_4_ = auVar169._4_4_ * fVar215;
  auVar80._8_4_ = auVar169._8_4_ * fVar217;
  auVar80._12_4_ = auVar169._12_4_ * fVar219;
  auVar169 = vpminsd_avx(auVar145,auVar226);
  auVar6 = vpminsd_avx(auVar253,auVar116);
  auVar169 = vmaxps_avx(auVar169,auVar6);
  auVar6 = vpminsd_avx(auVar163,auVar80);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._4_4_ = uVar75;
  auVar303._0_4_ = uVar75;
  auVar303._8_4_ = uVar75;
  auVar303._12_4_ = uVar75;
  auVar6 = vmaxps_avx(auVar6,auVar303);
  auVar169 = vmaxps_avx(auVar169,auVar6);
  local_5e0._0_4_ = auVar169._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar169._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar169._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar169._12_4_ * 0.99999964;
  auVar169 = vpmaxsd_avx(auVar145,auVar226);
  auVar6 = vpmaxsd_avx(auVar253,auVar116);
  auVar169 = vminps_avx(auVar169,auVar6);
  auVar6 = vpmaxsd_avx(auVar163,auVar80);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar146._4_4_ = uVar75;
  auVar146._0_4_ = uVar75;
  auVar146._8_4_ = uVar75;
  auVar146._12_4_ = uVar75;
  auVar6 = vminps_avx(auVar6,auVar146);
  auVar169 = vminps_avx(auVar169,auVar6);
  auVar6 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar6 = vpcmpgtd_avx(auVar6,_DAT_01f4ad30);
  auVar81._0_4_ = auVar169._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar169._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar169._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar169._12_4_ * 1.0000004;
  auVar169 = vcmpps_avx(local_5e0,auVar81,2);
  auVar169 = vandps_avx(auVar169,auVar6);
  uVar75 = vmovmskps_avx(auVar169);
  uVar69 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar75);
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_500 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8c8 = prim;
LAB_007dac5d:
  if (uVar69 == 0) {
    return;
  }
  lVar71 = 0;
  if (uVar69 != 0) {
    for (; (uVar69 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar74 = *(uint *)(local_8c8 + 2);
  local_8c0 = (ulong)*(uint *)(local_8c8 + lVar71 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar74].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           local_8c0 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar169 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar70);
  auVar6 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar70 + 1));
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar14 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar161 = *(float *)(ray + k * 4 + 0x40);
  auVar340._4_4_ = fVar161;
  auVar340._0_4_ = fVar161;
  auVar340._8_4_ = fVar161;
  auVar340._12_4_ = fVar161;
  fStack_a10 = fVar161;
  _local_a20 = auVar340;
  fStack_a0c = fVar161;
  fStack_a08 = fVar161;
  fStack_a04 = fVar161;
  fVar193 = *(float *)(ray + k * 4 + 0x50);
  auVar356._4_4_ = fVar193;
  auVar356._0_4_ = fVar193;
  auVar356._8_4_ = fVar193;
  auVar356._12_4_ = fVar193;
  fStack_670 = fVar193;
  _local_680 = auVar356;
  fStack_66c = fVar193;
  fStack_668 = fVar193;
  fStack_664 = fVar193;
  auVar117 = vunpcklps_avx(auVar340,auVar356);
  fVar182 = *(float *)(ray + k * 4 + 0x60);
  auVar359._4_4_ = fVar182;
  auVar359._0_4_ = fVar182;
  auVar359._8_4_ = fVar182;
  auVar359._12_4_ = fVar182;
  fStack_870 = fVar182;
  _local_880 = auVar359;
  fStack_86c = fVar182;
  fStack_868 = fVar182;
  fStack_864 = fVar182;
  _local_9b0 = vinsertps_avx(auVar117,auVar359,0x28);
  pfVar1 = (float *)(pGVar3[2].intersectionFilterN + uVar70 * (long)pGVar3[2].pointQueryFunc);
  auVar196._0_4_ = auVar169._0_4_ + *pfVar1 * 0.33333334;
  auVar196._4_4_ = auVar169._4_4_ + pfVar1[1] * 0.33333334;
  auVar196._8_4_ = auVar169._8_4_ + pfVar1[2] * 0.33333334;
  auVar196._12_4_ = auVar169._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar3[2].intersectionFilterN + (long)pGVar3[2].pointQueryFunc * (uVar70 + 1));
  auVar82._0_4_ = *pfVar1 * 0.33333334;
  auVar82._4_4_ = pfVar1[1] * 0.33333334;
  auVar82._8_4_ = pfVar1[2] * 0.33333334;
  auVar82._12_4_ = pfVar1[3] * 0.33333334;
  auVar15 = vsubps_avx(auVar6,auVar82);
  auVar83._0_4_ = (auVar6._0_4_ + auVar169._0_4_ + auVar196._0_4_ + auVar15._0_4_) * 0.25;
  auVar83._4_4_ = (auVar6._4_4_ + auVar169._4_4_ + auVar196._4_4_ + auVar15._4_4_) * 0.25;
  auVar83._8_4_ = (auVar6._8_4_ + auVar169._8_4_ + auVar196._8_4_ + auVar15._8_4_) * 0.25;
  auVar83._12_4_ = (auVar6._12_4_ + auVar169._12_4_ + auVar196._12_4_ + auVar15._12_4_) * 0.25;
  auVar117 = vsubps_avx(auVar83,auVar14);
  auVar117 = vdpps_avx(auVar117,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar254 = vrcpss_avx(local_9c0,local_9c0);
  fVar215 = auVar117._0_4_ * auVar254._0_4_ * (2.0 - local_9c0._0_4_ * auVar254._0_4_);
  auVar254 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
  auVar164._0_4_ = auVar14._0_4_ + local_9b0._0_4_ * auVar254._0_4_;
  auVar164._4_4_ = auVar14._4_4_ + local_9b0._4_4_ * auVar254._4_4_;
  auVar164._8_4_ = auVar14._8_4_ + local_9b0._8_4_ * auVar254._8_4_;
  auVar164._12_4_ = auVar14._12_4_ + local_9b0._12_4_ * auVar254._12_4_;
  auVar117 = vblendps_avx(auVar164,_DAT_01f45a50,8);
  auVar80 = vsubps_avx(auVar169,auVar117);
  auVar15 = vsubps_avx(auVar15,auVar117);
  auVar81 = vsubps_avx(auVar196,auVar117);
  auVar116 = vsubps_avx(auVar6,auVar117);
  auVar169 = vshufps_avx(auVar80,auVar80,0);
  register0x00001250 = auVar169;
  _local_1e0 = auVar169;
  auVar169 = vshufps_avx(auVar80,auVar80,0x55);
  auVar131._16_16_ = auVar169;
  auVar131._0_16_ = auVar169;
  auVar6 = vshufps_avx(auVar80,auVar80,0xaa);
  local_360._16_16_ = auVar6;
  local_360._0_16_ = auVar6;
  auVar6 = vshufps_avx(auVar80,auVar80,0xff);
  auVar117 = vshufps_avx(auVar81,auVar81,0);
  auVar258._16_16_ = auVar117;
  auVar258._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar81,auVar81,0x55);
  local_940._16_16_ = auVar117;
  local_940._0_16_ = auVar117;
  auVar361 = ZEXT3264(local_940);
  auVar117 = vshufps_avx(auVar81,auVar81,0xaa);
  auVar289._16_16_ = auVar117;
  auVar289._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar81,auVar81,0xff);
  local_980._16_16_ = auVar117;
  local_980._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar15,auVar15,0);
  local_380._16_16_ = auVar117;
  local_380._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar15,auVar15,0x55);
  local_3a0._16_16_ = auVar117;
  local_3a0._0_16_ = auVar117;
  auVar117 = vshufps_avx(auVar15,auVar15,0xaa);
  register0x00001290 = auVar117;
  _local_200 = auVar117;
  auVar117 = vshufps_avx(auVar15,auVar15,0xff);
  register0x00001290 = auVar117;
  _local_220 = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0);
  register0x00001290 = auVar117;
  _local_240 = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0x55);
  register0x00001290 = auVar117;
  _local_260 = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0xaa);
  register0x00001290 = auVar117;
  _local_280 = auVar117;
  auVar117 = vshufps_avx(auVar116,auVar116,0xff);
  auVar264 = ZEXT3264(local_980);
  register0x00001290 = auVar117;
  _local_2a0 = auVar117;
  auVar117 = ZEXT416((uint)(fVar161 * fVar161 + fVar193 * fVar193 + fVar182 * fVar182));
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  local_2c0._16_16_ = auVar117;
  local_2c0._0_16_ = auVar117;
  fVar161 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar215);
  auVar117 = vshufps_avx(ZEXT416((uint)(fVar161 - fVar215)),ZEXT416((uint)(fVar161 - fVar215)),0);
  local_3c0._16_16_ = auVar117;
  local_3c0._0_16_ = auVar117;
  local_770 = vpshufd_avx(ZEXT416(uVar74),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_8c8 + lVar71 * 4 + 6)),0);
  register0x00001210 = auVar254;
  _local_8a0 = auVar254;
  uVar70 = 0;
  local_c48 = 1;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  local_5a0 = vandps_avx(local_2c0,auVar95);
  auVar117 = vsqrtss_avx(local_9c0,local_9c0);
  auVar14 = vsqrtss_avx(local_9c0,local_9c0);
  local_a40._0_4_ = auVar169._0_4_;
  local_a40._4_4_ = auVar169._4_4_;
  fStack_a38 = auVar169._8_4_;
  fStack_a34 = auVar169._12_4_;
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_580 = auVar258;
  fVar193 = (float)local_a40._0_4_;
  fVar182 = (float)local_a40._4_4_;
  fVar215 = fStack_a38;
  fVar184 = fStack_a34;
  fVar217 = (float)local_a40._0_4_;
  fVar186 = (float)local_a40._4_4_;
  fVar219 = fStack_a38;
  local_ac0 = auVar289;
  _local_a40 = auVar131;
  do {
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = 0x3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar233._16_4_ = 0x3f800000;
    auVar233._20_4_ = 0x3f800000;
    auVar233._24_4_ = 0x3f800000;
    auVar233._28_4_ = 0x3f800000;
    auVar169 = vmovshdup_avx(local_5d0);
    auVar79 = vsubps_avx(auVar169,local_5d0);
    auVar169 = vshufps_avx(local_5d0,local_5d0,0);
    local_7c0._16_16_ = auVar169;
    local_7c0._0_16_ = auVar169;
    auVar254 = vshufps_avx(auVar79,auVar79,0);
    local_7e0._16_16_ = auVar254;
    local_7e0._0_16_ = auVar254;
    fVar114 = auVar254._0_4_;
    fVar142 = auVar254._4_4_;
    fVar143 = auVar254._8_4_;
    fVar144 = auVar254._12_4_;
    fVar364 = auVar169._0_4_;
    auVar132._0_4_ = fVar364 + fVar114 * 0.0;
    fVar105 = auVar169._4_4_;
    auVar132._4_4_ = fVar105 + fVar142 * 0.14285715;
    fVar107 = auVar169._8_4_;
    auVar132._8_4_ = fVar107 + fVar143 * 0.2857143;
    fVar109 = auVar169._12_4_;
    auVar132._12_4_ = fVar109 + fVar144 * 0.42857146;
    auVar132._16_4_ = fVar364 + fVar114 * 0.5714286;
    auVar132._20_4_ = fVar105 + fVar142 * 0.71428573;
    auVar132._24_4_ = fVar107 + fVar143 * 0.8571429;
    auVar132._28_4_ = fVar109 + fVar144;
    auVar94 = vsubps_avx(auVar233,auVar132);
    fVar294 = auVar94._0_4_;
    fVar299 = auVar94._4_4_;
    fVar300 = auVar94._8_4_;
    fVar301 = auVar94._12_4_;
    fVar158 = auVar94._16_4_;
    fVar160 = auVar94._20_4_;
    fVar159 = auVar94._24_4_;
    fVar191 = auVar258._28_4_ + auVar289._28_4_;
    fVar283 = auVar264._28_4_;
    fVar192 = fVar283 + fVar191 + 1.0;
    fVar249 = local_380._0_4_ * auVar132._0_4_ + auVar258._0_4_ * fVar294;
    fVar265 = local_380._4_4_ * auVar132._4_4_ + auVar258._4_4_ * fVar299;
    fVar268 = local_380._8_4_ * auVar132._8_4_ + auVar258._8_4_ * fVar300;
    fVar271 = local_380._12_4_ * auVar132._12_4_ + auVar258._12_4_ * fVar301;
    fVar274 = local_380._16_4_ * auVar132._16_4_ + auVar258._16_4_ * fVar158;
    fVar277 = local_380._20_4_ * auVar132._20_4_ + auVar258._20_4_ * fVar160;
    fVar280 = local_380._24_4_ * auVar132._24_4_ + auVar258._24_4_ * fVar159;
    fVar162 = local_3a0._0_4_ * auVar132._0_4_ + auVar361._0_4_ * fVar294;
    fVar183 = local_3a0._4_4_ * auVar132._4_4_ + auVar361._4_4_ * fVar299;
    fVar185 = local_3a0._8_4_ * auVar132._8_4_ + auVar361._8_4_ * fVar300;
    fVar187 = local_3a0._12_4_ * auVar132._12_4_ + auVar361._12_4_ * fVar301;
    fVar188 = local_3a0._16_4_ * auVar132._16_4_ + auVar361._16_4_ * fVar158;
    fVar189 = local_3a0._20_4_ * auVar132._20_4_ + auVar361._20_4_ * fVar160;
    fVar190 = local_3a0._24_4_ * auVar132._24_4_ + auVar361._24_4_ * fVar159;
    fVar194 = (float)local_200._0_4_ * auVar132._0_4_ + auVar289._0_4_ * fVar294;
    fVar216 = (float)local_200._4_4_ * auVar132._4_4_ + auVar289._4_4_ * fVar299;
    fVar218 = fStack_1f8 * auVar132._8_4_ + auVar289._8_4_ * fVar300;
    fVar220 = fStack_1f4 * auVar132._12_4_ + auVar289._12_4_ * fVar301;
    fVar221 = fStack_1f0 * auVar132._16_4_ + auVar289._16_4_ * fVar158;
    fVar222 = fStack_1ec * auVar132._20_4_ + auVar289._20_4_ * fVar160;
    fVar223 = fStack_1e8 * auVar132._24_4_ + auVar289._24_4_ * fVar159;
    fVar224 = (float)local_220._0_4_ * auVar132._0_4_ + auVar264._0_4_ * fVar294;
    fVar243 = (float)local_220._4_4_ * auVar132._4_4_ + auVar264._4_4_ * fVar299;
    fVar244 = fStack_218 * auVar132._8_4_ + auVar264._8_4_ * fVar300;
    fVar245 = fStack_214 * auVar132._12_4_ + auVar264._12_4_ * fVar301;
    fVar246 = fStack_210 * auVar132._16_4_ + auVar264._16_4_ * fVar158;
    fVar247 = fStack_20c * auVar132._20_4_ + auVar264._20_4_ * fVar160;
    fVar248 = fStack_208 * auVar132._24_4_ + auVar264._24_4_ * fVar159;
    fVar355 = fVar283 + local_380._28_4_;
    fVar336 = local_360._28_4_ + fVar283;
    auVar296._0_4_ =
         fVar294 * (auVar258._0_4_ * auVar132._0_4_ + fVar294 * (float)local_1e0._0_4_) +
         auVar132._0_4_ * fVar249;
    auVar296._4_4_ =
         fVar299 * (auVar258._4_4_ * auVar132._4_4_ + fVar299 * (float)local_1e0._4_4_) +
         auVar132._4_4_ * fVar265;
    auVar296._8_4_ =
         fVar300 * (auVar258._8_4_ * auVar132._8_4_ + fVar300 * fStack_1d8) +
         auVar132._8_4_ * fVar268;
    auVar296._12_4_ =
         fVar301 * (auVar258._12_4_ * auVar132._12_4_ + fVar301 * fStack_1d4) +
         auVar132._12_4_ * fVar271;
    auVar296._16_4_ =
         fVar158 * (auVar258._16_4_ * auVar132._16_4_ + fVar158 * fStack_1d0) +
         auVar132._16_4_ * fVar274;
    auVar296._20_4_ =
         fVar160 * (auVar258._20_4_ * auVar132._20_4_ + fVar160 * fStack_1cc) +
         auVar132._20_4_ * fVar277;
    auVar296._24_4_ =
         fVar159 * (auVar258._24_4_ * auVar132._24_4_ + fVar159 * fStack_1c8) +
         auVar132._24_4_ * fVar280;
    auVar296._28_4_ = fStack_1e4 + fVar283;
    auVar306._0_4_ =
         (auVar361._0_4_ * auVar132._0_4_ + fVar193 * fVar294) * fVar294 + auVar132._0_4_ * fVar162;
    auVar306._4_4_ =
         (auVar361._4_4_ * auVar132._4_4_ + fVar182 * fVar299) * fVar299 + auVar132._4_4_ * fVar183;
    auVar306._8_4_ =
         (auVar361._8_4_ * auVar132._8_4_ + fVar215 * fVar300) * fVar300 + auVar132._8_4_ * fVar185;
    auVar306._12_4_ =
         (auVar361._12_4_ * auVar132._12_4_ + fVar184 * fVar301) * fVar301 +
         auVar132._12_4_ * fVar187;
    auVar306._16_4_ =
         (auVar361._16_4_ * auVar132._16_4_ + fVar217 * fVar158) * fVar158 +
         auVar132._16_4_ * fVar188;
    auVar306._20_4_ =
         (auVar361._20_4_ * auVar132._20_4_ + fVar186 * fVar160) * fVar160 +
         auVar132._20_4_ * fVar189;
    auVar306._24_4_ =
         (auVar361._24_4_ * auVar132._24_4_ + fVar219 * fVar159) * fVar159 +
         auVar132._24_4_ * fVar190;
    auVar306._28_4_ = fVar191 + 1.0 + fVar283;
    auVar315._0_4_ =
         fVar294 * (auVar289._0_4_ * auVar132._0_4_ + local_360._0_4_ * fVar294) +
         auVar132._0_4_ * fVar194;
    auVar315._4_4_ =
         fVar299 * (auVar289._4_4_ * auVar132._4_4_ + local_360._4_4_ * fVar299) +
         auVar132._4_4_ * fVar216;
    auVar315._8_4_ =
         fVar300 * (auVar289._8_4_ * auVar132._8_4_ + local_360._8_4_ * fVar300) +
         auVar132._8_4_ * fVar218;
    auVar315._12_4_ =
         fVar301 * (auVar289._12_4_ * auVar132._12_4_ + local_360._12_4_ * fVar301) +
         auVar132._12_4_ * fVar220;
    auVar315._16_4_ =
         fVar158 * (auVar289._16_4_ * auVar132._16_4_ + local_360._16_4_ * fVar158) +
         auVar132._16_4_ * fVar221;
    auVar315._20_4_ =
         fVar160 * (auVar289._20_4_ * auVar132._20_4_ + local_360._20_4_ * fVar160) +
         auVar132._20_4_ * fVar222;
    auVar315._24_4_ =
         fVar159 * (auVar289._24_4_ * auVar132._24_4_ + local_360._24_4_ * fVar159) +
         auVar132._24_4_ * fVar223;
    auVar315._28_4_ = fStack_204 + fVar283;
    auVar290._0_4_ =
         auVar132._0_4_ * fVar224 +
         fVar294 * (auVar264._0_4_ * auVar132._0_4_ + auVar6._0_4_ * fVar294);
    auVar290._4_4_ =
         auVar132._4_4_ * fVar243 +
         fVar299 * (auVar264._4_4_ * auVar132._4_4_ + auVar6._4_4_ * fVar299);
    auVar290._8_4_ =
         auVar132._8_4_ * fVar244 +
         fVar300 * (auVar264._8_4_ * auVar132._8_4_ + auVar6._8_4_ * fVar300);
    auVar290._12_4_ =
         auVar132._12_4_ * fVar245 +
         fVar301 * (auVar264._12_4_ * auVar132._12_4_ + auVar6._12_4_ * fVar301);
    auVar290._16_4_ =
         auVar132._16_4_ * fVar246 +
         fVar158 * (auVar264._16_4_ * auVar132._16_4_ + auVar6._0_4_ * fVar158);
    auVar290._20_4_ =
         auVar132._20_4_ * fVar247 +
         fVar160 * (auVar264._20_4_ * auVar132._20_4_ + auVar6._4_4_ * fVar160);
    auVar290._24_4_ =
         auVar132._24_4_ * fVar248 +
         fVar159 * (auVar264._24_4_ * auVar132._24_4_ + auVar6._8_4_ * fVar159);
    auVar290._28_4_ = fStack_204 + local_3a0._28_4_;
    auVar96._0_4_ =
         (auVar132._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar294) * auVar132._0_4_ +
         fVar294 * fVar249;
    auVar96._4_4_ =
         (auVar132._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar299) * auVar132._4_4_ +
         fVar299 * fVar265;
    auVar96._8_4_ =
         (auVar132._8_4_ * fStack_238 + local_380._8_4_ * fVar300) * auVar132._8_4_ +
         fVar300 * fVar268;
    auVar96._12_4_ =
         (auVar132._12_4_ * fStack_234 + local_380._12_4_ * fVar301) * auVar132._12_4_ +
         fVar301 * fVar271;
    auVar96._16_4_ =
         (auVar132._16_4_ * fStack_230 + local_380._16_4_ * fVar158) * auVar132._16_4_ +
         fVar158 * fVar274;
    auVar96._20_4_ =
         (auVar132._20_4_ * fStack_22c + local_380._20_4_ * fVar160) * auVar132._20_4_ +
         fVar160 * fVar277;
    auVar96._24_4_ =
         (auVar132._24_4_ * fStack_228 + local_380._24_4_ * fVar159) * auVar132._24_4_ +
         fVar159 * fVar280;
    auVar96._28_4_ = fStack_204 + fVar192 + fVar283;
    auVar178._0_4_ =
         (auVar132._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar294) * auVar132._0_4_ +
         fVar294 * fVar162;
    auVar178._4_4_ =
         (auVar132._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar299) * auVar132._4_4_ +
         fVar299 * fVar183;
    auVar178._8_4_ =
         (auVar132._8_4_ * fStack_258 + local_3a0._8_4_ * fVar300) * auVar132._8_4_ +
         fVar300 * fVar185;
    auVar178._12_4_ =
         (auVar132._12_4_ * fStack_254 + local_3a0._12_4_ * fVar301) * auVar132._12_4_ +
         fVar301 * fVar187;
    auVar178._16_4_ =
         (auVar132._16_4_ * fStack_250 + local_3a0._16_4_ * fVar158) * auVar132._16_4_ +
         fVar158 * fVar188;
    auVar178._20_4_ =
         (auVar132._20_4_ * fStack_24c + local_3a0._20_4_ * fVar160) * auVar132._20_4_ +
         fVar160 * fVar189;
    auVar178._24_4_ =
         (auVar132._24_4_ * fStack_248 + local_3a0._24_4_ * fVar159) * auVar132._24_4_ +
         fVar159 * fVar190;
    auVar178._28_4_ = fStack_204 + fVar192 + 1.0;
    auVar206._0_4_ =
         (auVar132._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar294) *
         auVar132._0_4_ + fVar294 * fVar194;
    auVar206._4_4_ =
         (auVar132._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar299) *
         auVar132._4_4_ + fVar299 * fVar216;
    auVar206._8_4_ =
         (auVar132._8_4_ * fStack_278 + fStack_1f8 * fVar300) * auVar132._8_4_ + fVar300 * fVar218;
    auVar206._12_4_ =
         (auVar132._12_4_ * fStack_274 + fStack_1f4 * fVar301) * auVar132._12_4_ + fVar301 * fVar220
    ;
    auVar206._16_4_ =
         (auVar132._16_4_ * fStack_270 + fStack_1f0 * fVar158) * auVar132._16_4_ + fVar158 * fVar221
    ;
    auVar206._20_4_ =
         (auVar132._20_4_ * fStack_26c + fStack_1ec * fVar160) * auVar132._20_4_ + fVar160 * fVar222
    ;
    auVar206._24_4_ =
         (auVar132._24_4_ * fStack_268 + fStack_1e8 * fVar159) * auVar132._24_4_ + fVar159 * fVar223
    ;
    auVar206._28_4_ = fVar336 + 2.0;
    auVar234._0_4_ =
         (auVar132._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar294) *
         auVar132._0_4_ + fVar294 * fVar224;
    auVar234._4_4_ =
         (auVar132._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar299) *
         auVar132._4_4_ + fVar299 * fVar243;
    auVar234._8_4_ =
         (auVar132._8_4_ * fStack_298 + fStack_218 * fVar300) * auVar132._8_4_ + fVar300 * fVar244;
    auVar234._12_4_ =
         (auVar132._12_4_ * fStack_294 + fStack_214 * fVar301) * auVar132._12_4_ + fVar301 * fVar245
    ;
    auVar234._16_4_ =
         (auVar132._16_4_ * fStack_290 + fStack_210 * fVar158) * auVar132._16_4_ + fVar158 * fVar246
    ;
    auVar234._20_4_ =
         (auVar132._20_4_ * fStack_28c + fStack_20c * fVar160) * auVar132._20_4_ + fVar160 * fVar247
    ;
    auVar234._24_4_ =
         (auVar132._24_4_ * fStack_288 + fStack_208 * fVar159) * auVar132._24_4_ + fVar159 * fVar248
    ;
    auVar234._28_4_ = fVar355 + local_360._28_4_ + 1.0;
    fVar250 = auVar296._0_4_ * fVar294 + auVar132._0_4_ * auVar96._0_4_;
    fVar266 = auVar296._4_4_ * fVar299 + auVar132._4_4_ * auVar96._4_4_;
    fVar269 = auVar296._8_4_ * fVar300 + auVar132._8_4_ * auVar96._8_4_;
    fVar272 = auVar296._12_4_ * fVar301 + auVar132._12_4_ * auVar96._12_4_;
    fVar275 = auVar296._16_4_ * fVar158 + auVar132._16_4_ * auVar96._16_4_;
    fVar278 = auVar296._20_4_ * fVar160 + auVar132._20_4_ * auVar96._20_4_;
    fVar281 = auVar296._24_4_ * fVar159 + auVar132._24_4_ * auVar96._24_4_;
    fVar284 = fVar355 + fStack_204;
    local_a00._0_4_ = auVar306._0_4_ * fVar294 + auVar132._0_4_ * auVar178._0_4_;
    local_a00._4_4_ = auVar306._4_4_ * fVar299 + auVar132._4_4_ * auVar178._4_4_;
    local_a00._8_4_ = auVar306._8_4_ * fVar300 + auVar132._8_4_ * auVar178._8_4_;
    local_a00._12_4_ = auVar306._12_4_ * fVar301 + auVar132._12_4_ * auVar178._12_4_;
    local_a00._16_4_ = auVar306._16_4_ * fVar158 + auVar132._16_4_ * auVar178._16_4_;
    local_a00._20_4_ = auVar306._20_4_ * fVar160 + auVar132._20_4_ * auVar178._20_4_;
    local_a00._24_4_ = auVar306._24_4_ * fVar159 + auVar132._24_4_ * auVar178._24_4_;
    local_a00._28_4_ = fStack_204 + fVar336;
    local_2e0._0_4_ = auVar315._0_4_ * fVar294 + auVar132._0_4_ * auVar206._0_4_;
    local_2e0._4_4_ = auVar315._4_4_ * fVar299 + auVar132._4_4_ * auVar206._4_4_;
    local_2e0._8_4_ = auVar315._8_4_ * fVar300 + auVar132._8_4_ * auVar206._8_4_;
    local_2e0._12_4_ = auVar315._12_4_ * fVar301 + auVar132._12_4_ * auVar206._12_4_;
    local_2e0._16_4_ = auVar315._16_4_ * fVar158 + auVar132._16_4_ * auVar206._16_4_;
    local_2e0._20_4_ = auVar315._20_4_ * fVar160 + auVar132._20_4_ * auVar206._20_4_;
    local_2e0._24_4_ = auVar315._24_4_ * fVar159 + auVar132._24_4_ * auVar206._24_4_;
    local_2e0._28_4_ = fVar336 + fStack_204;
    local_c20._0_4_ = auVar79._0_4_;
    auVar259._0_4_ = fVar294 * auVar290._0_4_ + auVar132._0_4_ * auVar234._0_4_;
    auVar259._4_4_ = fVar299 * auVar290._4_4_ + auVar132._4_4_ * auVar234._4_4_;
    auVar259._8_4_ = fVar300 * auVar290._8_4_ + auVar132._8_4_ * auVar234._8_4_;
    auVar259._12_4_ = fVar301 * auVar290._12_4_ + auVar132._12_4_ * auVar234._12_4_;
    auVar259._16_4_ = fVar158 * auVar290._16_4_ + auVar132._16_4_ * auVar234._16_4_;
    auVar259._20_4_ = fVar160 * auVar290._20_4_ + auVar132._20_4_ * auVar234._20_4_;
    auVar259._24_4_ = fVar159 * auVar290._24_4_ + auVar132._24_4_ * auVar234._24_4_;
    auVar259._28_4_ = auVar94._28_4_ + auVar132._28_4_;
    auVar94 = vsubps_avx(auVar96,auVar296);
    auVar95 = vsubps_avx(auVar178,auVar306);
    auVar258 = vsubps_avx(auVar206,auVar315);
    auVar131 = vsubps_avx(auVar234,auVar290);
    auVar169 = vshufps_avx(ZEXT416((uint)((float)local_c20._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c20._0_4_ * 0.04761905)),0);
    fVar219 = auVar169._0_4_;
    fVar325 = fVar219 * auVar94._0_4_ * 3.0;
    fVar158 = auVar169._4_4_;
    fVar330 = fVar158 * auVar94._4_4_ * 3.0;
    local_960._4_4_ = fVar330;
    local_960._0_4_ = fVar325;
    fVar160 = auVar169._8_4_;
    fVar331 = fVar160 * auVar94._8_4_ * 3.0;
    local_960._8_4_ = fVar331;
    fVar186 = auVar169._12_4_;
    fVar332 = fVar186 * auVar94._12_4_ * 3.0;
    local_960._12_4_ = fVar332;
    fVar333 = fVar219 * auVar94._16_4_ * 3.0;
    local_960._16_4_ = fVar333;
    fVar334 = fVar158 * auVar94._20_4_ * 3.0;
    local_960._20_4_ = fVar334;
    fVar335 = fVar160 * auVar94._24_4_ * 3.0;
    local_960._24_4_ = fVar335;
    local_960._28_4_ = fVar336;
    fVar314 = fVar219 * auVar95._0_4_ * 3.0;
    fVar319 = fVar158 * auVar95._4_4_ * 3.0;
    auVar20._4_4_ = fVar319;
    auVar20._0_4_ = fVar314;
    fVar320 = fVar160 * auVar95._8_4_ * 3.0;
    auVar20._8_4_ = fVar320;
    fVar321 = fVar186 * auVar95._12_4_ * 3.0;
    auVar20._12_4_ = fVar321;
    fVar322 = fVar219 * auVar95._16_4_ * 3.0;
    auVar20._16_4_ = fVar322;
    fVar323 = fVar158 * auVar95._20_4_ * 3.0;
    auVar20._20_4_ = fVar323;
    fVar324 = fVar160 * auVar95._24_4_ * 3.0;
    auVar20._24_4_ = fVar324;
    auVar20._28_4_ = auVar315._28_4_;
    fVar337 = fVar219 * auVar258._0_4_ * 3.0;
    fVar343 = fVar158 * auVar258._4_4_ * 3.0;
    auVar22._4_4_ = fVar343;
    auVar22._0_4_ = fVar337;
    fVar345 = fVar160 * auVar258._8_4_ * 3.0;
    auVar22._8_4_ = fVar345;
    fVar347 = fVar186 * auVar258._12_4_ * 3.0;
    auVar22._12_4_ = fVar347;
    fVar349 = fVar219 * auVar258._16_4_ * 3.0;
    auVar22._16_4_ = fVar349;
    fVar351 = fVar158 * auVar258._20_4_ * 3.0;
    auVar22._20_4_ = fVar351;
    fVar353 = fVar160 * auVar258._24_4_ * 3.0;
    auVar22._24_4_ = fVar353;
    auVar22._28_4_ = fVar355;
    fVar215 = fVar219 * auVar131._0_4_ * 3.0;
    fVar184 = fVar158 * auVar131._4_4_ * 3.0;
    auVar16._4_4_ = fVar184;
    auVar16._0_4_ = fVar215;
    fVar217 = fVar160 * auVar131._8_4_ * 3.0;
    auVar16._8_4_ = fVar217;
    fVar186 = fVar186 * auVar131._12_4_ * 3.0;
    auVar16._12_4_ = fVar186;
    fVar219 = fVar219 * auVar131._16_4_ * 3.0;
    auVar16._16_4_ = fVar219;
    fVar158 = fVar158 * auVar131._20_4_ * 3.0;
    auVar16._20_4_ = fVar158;
    fVar160 = fVar160 * auVar131._24_4_ * 3.0;
    auVar16._24_4_ = fVar160;
    auVar16._28_4_ = auVar95._28_4_;
    auVar94 = vperm2f128_avx(local_a00,local_a00,1);
    auVar94 = vshufps_avx(auVar94,local_a00,0x30);
    auVar131 = vshufps_avx(local_a00,auVar94,0x29);
    auVar94 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar94 = vshufps_avx(auVar94,local_2e0,0x30);
    auVar289 = vshufps_avx(local_2e0,auVar94,0x29);
    auVar258 = vsubps_avx(auVar259,auVar16);
    auVar94 = vperm2f128_avx(auVar258,auVar258,1);
    auVar94 = vshufps_avx(auVar94,auVar258,0x30);
    auVar16 = vshufps_avx(auVar258,auVar94,0x29);
    local_6c0 = vsubps_avx(auVar131,local_a00);
    local_300 = vsubps_avx(auVar289,local_2e0);
    fVar294 = local_6c0._0_4_;
    fVar159 = local_6c0._4_4_;
    auVar17._4_4_ = fVar343 * fVar159;
    auVar17._0_4_ = fVar337 * fVar294;
    fVar189 = local_6c0._8_4_;
    auVar17._8_4_ = fVar345 * fVar189;
    fVar218 = local_6c0._12_4_;
    auVar17._12_4_ = fVar347 * fVar218;
    fVar243 = local_6c0._16_4_;
    auVar17._16_4_ = fVar349 * fVar243;
    fVar249 = local_6c0._20_4_;
    auVar17._20_4_ = fVar351 * fVar249;
    fVar280 = local_6c0._24_4_;
    auVar17._24_4_ = fVar353 * fVar280;
    auVar17._28_4_ = auVar258._28_4_;
    fVar299 = local_300._0_4_;
    fVar162 = local_300._4_4_;
    auVar18._4_4_ = fVar319 * fVar162;
    auVar18._0_4_ = fVar314 * fVar299;
    fVar190 = local_300._8_4_;
    auVar18._8_4_ = fVar320 * fVar190;
    fVar220 = local_300._12_4_;
    auVar18._12_4_ = fVar321 * fVar220;
    fVar244 = local_300._16_4_;
    auVar18._16_4_ = fVar322 * fVar244;
    fVar265 = local_300._20_4_;
    auVar18._20_4_ = fVar323 * fVar265;
    fVar283 = local_300._24_4_;
    auVar18._24_4_ = fVar324 * fVar283;
    auVar18._28_4_ = auVar94._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar17);
    auVar63._4_4_ = fVar266;
    auVar63._0_4_ = fVar250;
    auVar63._8_4_ = fVar269;
    auVar63._12_4_ = fVar272;
    auVar63._16_4_ = fVar275;
    auVar63._20_4_ = fVar278;
    auVar63._24_4_ = fVar281;
    auVar63._28_4_ = fVar284;
    auVar94 = vperm2f128_avx(auVar63,auVar63,1);
    auVar94 = vshufps_avx(auVar94,auVar63,0x30);
    auVar17 = vshufps_avx(auVar63,auVar94,0x29);
    local_520 = vsubps_avx(auVar17,auVar63);
    auVar207._4_4_ = fVar330 * fVar162;
    auVar207._0_4_ = fVar325 * fVar299;
    auVar207._8_4_ = fVar331 * fVar190;
    auVar207._12_4_ = fVar332 * fVar220;
    auVar207._16_4_ = fVar333 * fVar244;
    auVar207._20_4_ = fVar334 * fVar265;
    auVar207._24_4_ = fVar335 * fVar283;
    auVar207._28_4_ = auVar17._28_4_;
    fVar300 = local_520._0_4_;
    fVar183 = local_520._4_4_;
    auVar19._4_4_ = fVar343 * fVar183;
    auVar19._0_4_ = fVar337 * fVar300;
    fVar191 = local_520._8_4_;
    auVar19._8_4_ = fVar345 * fVar191;
    fVar221 = local_520._12_4_;
    auVar19._12_4_ = fVar347 * fVar221;
    fVar245 = local_520._16_4_;
    auVar19._16_4_ = fVar349 * fVar245;
    fVar268 = local_520._20_4_;
    auVar19._20_4_ = fVar351 * fVar268;
    fVar12 = local_520._24_4_;
    auVar19._24_4_ = fVar353 * fVar12;
    auVar19._28_4_ = auVar296._28_4_;
    auVar207 = vsubps_avx(auVar19,auVar207);
    auVar208._4_4_ = fVar319 * fVar183;
    auVar208._0_4_ = fVar314 * fVar300;
    auVar208._8_4_ = fVar320 * fVar191;
    auVar208._12_4_ = fVar321 * fVar221;
    auVar208._16_4_ = fVar322 * fVar245;
    auVar208._20_4_ = fVar323 * fVar268;
    auVar208._24_4_ = fVar324 * fVar12;
    auVar208._28_4_ = auVar296._28_4_;
    auVar21._4_4_ = fVar330 * fVar159;
    auVar21._0_4_ = fVar325 * fVar294;
    auVar21._8_4_ = fVar331 * fVar189;
    auVar21._12_4_ = fVar332 * fVar218;
    auVar21._16_4_ = fVar333 * fVar243;
    auVar21._20_4_ = fVar334 * fVar249;
    auVar21._24_4_ = fVar335 * fVar280;
    auVar21._28_4_ = auVar306._28_4_;
    auVar19 = vsubps_avx(auVar21,auVar208);
    fVar193 = auVar19._28_4_;
    auVar179._0_4_ = fVar300 * fVar300 + fVar294 * fVar294 + fVar299 * fVar299;
    auVar179._4_4_ = fVar183 * fVar183 + fVar159 * fVar159 + fVar162 * fVar162;
    auVar179._8_4_ = fVar191 * fVar191 + fVar189 * fVar189 + fVar190 * fVar190;
    auVar179._12_4_ = fVar221 * fVar221 + fVar218 * fVar218 + fVar220 * fVar220;
    auVar179._16_4_ = fVar245 * fVar245 + fVar243 * fVar243 + fVar244 * fVar244;
    auVar179._20_4_ = fVar268 * fVar268 + fVar249 * fVar249 + fVar265 * fVar265;
    auVar179._24_4_ = fVar12 * fVar12 + fVar280 * fVar280 + fVar283 * fVar283;
    auVar179._28_4_ = fVar193 + fVar193 + auVar18._28_4_;
    auVar94 = vrcpps_avx(auVar179);
    fVar187 = auVar94._0_4_;
    fVar188 = auVar94._4_4_;
    auVar23._4_4_ = fVar188 * auVar179._4_4_;
    auVar23._0_4_ = fVar187 * auVar179._0_4_;
    fVar194 = auVar94._8_4_;
    auVar23._8_4_ = fVar194 * auVar179._8_4_;
    fVar216 = auVar94._12_4_;
    auVar23._12_4_ = fVar216 * auVar179._12_4_;
    fVar223 = auVar94._16_4_;
    auVar23._16_4_ = fVar223 * auVar179._16_4_;
    fVar224 = auVar94._20_4_;
    auVar23._20_4_ = fVar224 * auVar179._20_4_;
    fVar247 = auVar94._24_4_;
    auVar23._24_4_ = fVar247 * auVar179._24_4_;
    auVar23._28_4_ = auVar306._28_4_;
    auVar97._8_4_ = 0x3f800000;
    auVar97._0_8_ = 0x3f8000003f800000;
    auVar97._12_4_ = 0x3f800000;
    auVar97._16_4_ = 0x3f800000;
    auVar97._20_4_ = 0x3f800000;
    auVar97._24_4_ = 0x3f800000;
    auVar97._28_4_ = 0x3f800000;
    auVar208 = vsubps_avx(auVar97,auVar23);
    fVar187 = fVar187 + fVar187 * auVar208._0_4_;
    fVar188 = fVar188 + fVar188 * auVar208._4_4_;
    fVar194 = fVar194 + fVar194 * auVar208._8_4_;
    fVar216 = fVar216 + fVar216 * auVar208._12_4_;
    fVar223 = fVar223 + fVar223 * auVar208._16_4_;
    fVar224 = fVar224 + fVar224 * auVar208._20_4_;
    fVar247 = fVar247 + fVar247 * auVar208._24_4_;
    auVar258 = vperm2f128_avx(auVar20,auVar20,1);
    auVar258 = vshufps_avx(auVar258,auVar20,0x30);
    local_aa0 = vshufps_avx(auVar20,auVar258,0x29);
    auVar258 = vperm2f128_avx(auVar22,auVar22,1);
    auVar258 = vshufps_avx(auVar258,auVar22,0x30);
    local_9e0 = vshufps_avx(auVar22,auVar258,0x29);
    fVar78 = local_9e0._0_4_;
    fVar106 = local_9e0._4_4_;
    auVar24._4_4_ = fVar106 * fVar159;
    auVar24._0_4_ = fVar78 * fVar294;
    fVar108 = local_9e0._8_4_;
    auVar24._8_4_ = fVar108 * fVar189;
    fVar110 = local_9e0._12_4_;
    auVar24._12_4_ = fVar110 * fVar218;
    fVar111 = local_9e0._16_4_;
    auVar24._16_4_ = fVar111 * fVar243;
    fVar112 = local_9e0._20_4_;
    auVar24._20_4_ = fVar112 * fVar249;
    fVar113 = local_9e0._24_4_;
    auVar24._24_4_ = fVar113 * fVar280;
    auVar24._28_4_ = auVar258._28_4_;
    fVar301 = local_aa0._0_4_;
    fVar185 = local_aa0._4_4_;
    auVar25._4_4_ = fVar162 * fVar185;
    auVar25._0_4_ = fVar299 * fVar301;
    fVar192 = local_aa0._8_4_;
    auVar25._8_4_ = fVar190 * fVar192;
    fVar222 = local_aa0._12_4_;
    auVar25._12_4_ = fVar220 * fVar222;
    fVar246 = local_aa0._16_4_;
    auVar25._16_4_ = fVar244 * fVar246;
    fVar271 = local_aa0._20_4_;
    auVar25._20_4_ = fVar265 * fVar271;
    fVar362 = local_aa0._24_4_;
    auVar25._24_4_ = fVar283 * fVar362;
    auVar25._28_4_ = auVar315._28_4_;
    auVar20 = vsubps_avx(auVar25,auVar24);
    auVar258 = vperm2f128_avx(local_960,local_960,1);
    auVar258 = vshufps_avx(auVar258,local_960,0x30);
    local_920 = vshufps_avx(local_960,auVar258,0x29);
    fVar338 = local_920._0_4_;
    fVar344 = local_920._4_4_;
    auVar26._4_4_ = fVar344 * fVar162;
    auVar26._0_4_ = fVar338 * fVar299;
    fVar346 = local_920._8_4_;
    auVar26._8_4_ = fVar346 * fVar190;
    fVar348 = local_920._12_4_;
    auVar26._12_4_ = fVar348 * fVar220;
    fVar350 = local_920._16_4_;
    auVar26._16_4_ = fVar350 * fVar244;
    fVar352 = local_920._20_4_;
    auVar26._20_4_ = fVar352 * fVar265;
    fVar354 = local_920._24_4_;
    auVar26._24_4_ = fVar354 * fVar283;
    auVar26._28_4_ = auVar258._28_4_;
    auVar27._4_4_ = fVar183 * fVar106;
    auVar27._0_4_ = fVar300 * fVar78;
    auVar27._8_4_ = fVar191 * fVar108;
    auVar27._12_4_ = fVar221 * fVar110;
    auVar27._16_4_ = fVar245 * fVar111;
    auVar27._20_4_ = fVar268 * fVar112;
    auVar27._24_4_ = fVar12 * fVar113;
    auVar27._28_4_ = fVar336;
    auVar258 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar183 * fVar185;
    auVar28._0_4_ = fVar300 * fVar301;
    auVar28._8_4_ = fVar191 * fVar192;
    auVar28._12_4_ = fVar221 * fVar222;
    auVar28._16_4_ = fVar245 * fVar246;
    auVar28._20_4_ = fVar268 * fVar271;
    auVar28._24_4_ = fVar12 * fVar362;
    auVar28._28_4_ = fVar336;
    auVar29._4_4_ = fVar344 * fVar159;
    auVar29._0_4_ = fVar338 * fVar294;
    auVar29._8_4_ = fVar346 * fVar189;
    auVar29._12_4_ = fVar348 * fVar218;
    auVar29._16_4_ = fVar350 * fVar243;
    auVar29._20_4_ = fVar352 * fVar249;
    fVar182 = local_920._28_4_;
    auVar29._24_4_ = fVar354 * fVar280;
    auVar29._28_4_ = fVar182;
    auVar21 = vsubps_avx(auVar29,auVar28);
    auVar30._4_4_ =
         fVar188 * (auVar18._4_4_ * auVar18._4_4_ +
                   auVar19._4_4_ * auVar19._4_4_ + auVar207._4_4_ * auVar207._4_4_);
    auVar30._0_4_ =
         fVar187 * (auVar18._0_4_ * auVar18._0_4_ +
                   auVar19._0_4_ * auVar19._0_4_ + auVar207._0_4_ * auVar207._0_4_);
    auVar30._8_4_ =
         fVar194 * (auVar18._8_4_ * auVar18._8_4_ +
                   auVar19._8_4_ * auVar19._8_4_ + auVar207._8_4_ * auVar207._8_4_);
    auVar30._12_4_ =
         fVar216 * (auVar18._12_4_ * auVar18._12_4_ +
                   auVar19._12_4_ * auVar19._12_4_ + auVar207._12_4_ * auVar207._12_4_);
    auVar30._16_4_ =
         fVar223 * (auVar18._16_4_ * auVar18._16_4_ +
                   auVar19._16_4_ * auVar19._16_4_ + auVar207._16_4_ * auVar207._16_4_);
    auVar30._20_4_ =
         fVar224 * (auVar18._20_4_ * auVar18._20_4_ +
                   auVar19._20_4_ * auVar19._20_4_ + auVar207._20_4_ * auVar207._20_4_);
    auVar30._24_4_ =
         fVar247 * (auVar18._24_4_ * auVar18._24_4_ +
                   auVar19._24_4_ * auVar19._24_4_ + auVar207._24_4_ * auVar207._24_4_);
    auVar30._28_4_ = auVar18._28_4_ + fVar193 + auVar207._28_4_;
    auVar31._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar258._4_4_ * auVar258._4_4_ + auVar21._4_4_ * auVar21._4_4_) * fVar188;
    auVar31._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar258._0_4_ * auVar258._0_4_ + auVar21._0_4_ * auVar21._0_4_) * fVar187;
    auVar31._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar258._8_4_ * auVar258._8_4_ + auVar21._8_4_ * auVar21._8_4_) * fVar194;
    auVar31._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar258._12_4_ * auVar258._12_4_ + auVar21._12_4_ * auVar21._12_4_) * fVar216;
    auVar31._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar258._16_4_ * auVar258._16_4_ + auVar21._16_4_ * auVar21._16_4_) * fVar223;
    auVar31._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar258._20_4_ * auVar258._20_4_ + auVar21._20_4_ * auVar21._20_4_) * fVar224;
    auVar31._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar258._24_4_ * auVar258._24_4_ + auVar21._24_4_ * auVar21._24_4_) * fVar247;
    auVar31._28_4_ = auVar94._28_4_ + auVar208._28_4_;
    auVar94 = vmaxps_avx(auVar30,auVar31);
    auVar258 = vperm2f128_avx(auVar259,auVar259,1);
    auVar258 = vshufps_avx(auVar258,auVar259,0x30);
    auVar18 = vshufps_avx(auVar259,auVar258,0x29);
    local_600._0_4_ = auVar259._0_4_ + fVar215;
    local_600._4_4_ = auVar259._4_4_ + fVar184;
    local_600._8_4_ = auVar259._8_4_ + fVar217;
    local_600._12_4_ = auVar259._12_4_ + fVar186;
    local_600._16_4_ = auVar259._16_4_ + fVar219;
    local_600._20_4_ = auVar259._20_4_ + fVar158;
    local_600._24_4_ = auVar259._24_4_ + fVar160;
    local_600._28_4_ = auVar259._28_4_ + auVar95._28_4_;
    auVar258 = vmaxps_avx(auVar259,local_600);
    auVar95 = vmaxps_avx(auVar16,auVar18);
    auVar258 = vmaxps_avx(auVar258,auVar95);
    auVar95 = vrsqrtps_avx(auVar179);
    fVar193 = auVar95._0_4_;
    fVar215 = auVar95._4_4_;
    fVar184 = auVar95._8_4_;
    fVar217 = auVar95._12_4_;
    fVar186 = auVar95._16_4_;
    fVar219 = auVar95._20_4_;
    fVar158 = auVar95._24_4_;
    local_5c0 = fVar193 * 1.5 + fVar193 * fVar193 * fVar193 * auVar179._0_4_ * -0.5;
    fStack_5bc = fVar215 * 1.5 + fVar215 * fVar215 * fVar215 * auVar179._4_4_ * -0.5;
    fStack_5b8 = fVar184 * 1.5 + fVar184 * fVar184 * fVar184 * auVar179._8_4_ * -0.5;
    fStack_5b4 = fVar217 * 1.5 + fVar217 * fVar217 * fVar217 * auVar179._12_4_ * -0.5;
    fStack_5b0 = fVar186 * 1.5 + fVar186 * fVar186 * fVar186 * auVar179._16_4_ * -0.5;
    fStack_5ac = fVar219 * 1.5 + fVar219 * fVar219 * fVar219 * auVar179._20_4_ * -0.5;
    fStack_5a8 = fVar158 * 1.5 + fVar158 * fVar158 * fVar158 * auVar179._24_4_ * -0.5;
    auVar207 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_7a0 = vsubps_avx(auVar207,local_a00);
    auVar207 = vsubps_avx(auVar207,local_2e0);
    fVar305 = auVar207._0_4_;
    fVar308 = auVar207._4_4_;
    fVar309 = auVar207._8_4_;
    fVar310 = auVar207._12_4_;
    fVar311 = auVar207._16_4_;
    fVar312 = auVar207._20_4_;
    fVar313 = auVar207._24_4_;
    fVar158 = local_7a0._0_4_;
    fVar187 = local_7a0._4_4_;
    fVar194 = local_7a0._8_4_;
    fVar223 = local_7a0._12_4_;
    fVar247 = local_7a0._16_4_;
    fVar274 = local_7a0._20_4_;
    fVar336 = local_7a0._24_4_;
    auVar64._4_4_ = fVar266;
    auVar64._0_4_ = fVar250;
    auVar64._8_4_ = fVar269;
    auVar64._12_4_ = fVar272;
    auVar64._16_4_ = fVar275;
    auVar64._20_4_ = fVar278;
    auVar64._24_4_ = fVar281;
    auVar64._28_4_ = fVar284;
    auVar208 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar207 = vsubps_avx(auVar208,auVar64);
    fVar160 = auVar207._0_4_;
    fVar188 = auVar207._4_4_;
    fVar216 = auVar207._8_4_;
    fVar224 = auVar207._12_4_;
    fVar248 = auVar207._16_4_;
    fVar277 = auVar207._20_4_;
    fVar363 = auVar207._24_4_;
    auVar327._0_4_ =
         (float)local_a20._0_4_ * fVar160 +
         (float)local_680._0_4_ * fVar158 + fVar305 * (float)local_880._0_4_;
    auVar327._4_4_ =
         (float)local_a20._4_4_ * fVar188 +
         (float)local_680._4_4_ * fVar187 + fVar308 * (float)local_880._4_4_;
    auVar327._8_4_ = fStack_a18 * fVar216 + fStack_678 * fVar194 + fVar309 * fStack_878;
    auVar327._12_4_ = fStack_a14 * fVar224 + fStack_674 * fVar223 + fVar310 * fStack_874;
    auVar327._16_4_ = fStack_a10 * fVar248 + fStack_670 * fVar247 + fVar311 * fStack_870;
    auVar327._20_4_ = fStack_a0c * fVar277 + fStack_66c * fVar274 + fVar312 * fStack_86c;
    auVar327._24_4_ = fStack_a08 * fVar363 + fStack_668 * fVar336 + fVar313 * fStack_868;
    auVar327._28_4_ = fVar182 + auVar21._28_4_ + auVar179._28_4_;
    auVar341._0_4_ = fVar160 * fVar160 + fVar158 * fVar158 + fVar305 * fVar305;
    auVar341._4_4_ = fVar188 * fVar188 + fVar187 * fVar187 + fVar308 * fVar308;
    auVar341._8_4_ = fVar216 * fVar216 + fVar194 * fVar194 + fVar309 * fVar309;
    auVar341._12_4_ = fVar224 * fVar224 + fVar223 * fVar223 + fVar310 * fVar310;
    auVar341._16_4_ = fVar248 * fVar248 + fVar247 * fVar247 + fVar311 * fVar311;
    auVar341._20_4_ = fVar277 * fVar277 + fVar274 * fVar274 + fVar312 * fVar312;
    auVar341._24_4_ = fVar363 * fVar363 + fVar336 * fVar336 + fVar313 * fVar313;
    auVar341._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar182;
    local_540 = (float)local_a20._0_4_ * fVar300 * local_5c0 +
                local_5c0 * fVar294 * (float)local_680._0_4_ +
                fVar299 * local_5c0 * (float)local_880._0_4_;
    fStack_53c = (float)local_a20._4_4_ * fVar183 * fStack_5bc +
                 fStack_5bc * fVar159 * (float)local_680._4_4_ +
                 fVar162 * fStack_5bc * (float)local_880._4_4_;
    fStack_538 = fStack_a18 * fVar191 * fStack_5b8 +
                 fStack_5b8 * fVar189 * fStack_678 + fVar190 * fStack_5b8 * fStack_878;
    fStack_534 = fStack_a14 * fVar221 * fStack_5b4 +
                 fStack_5b4 * fVar218 * fStack_674 + fVar220 * fStack_5b4 * fStack_874;
    fStack_530 = fStack_a10 * fVar245 * fStack_5b0 +
                 fStack_5b0 * fVar243 * fStack_670 + fVar244 * fStack_5b0 * fStack_870;
    fStack_52c = fStack_a0c * fVar268 * fStack_5ac +
                 fStack_5ac * fVar249 * fStack_66c + fVar265 * fStack_5ac * fStack_86c;
    fStack_528 = fStack_a08 * fVar12 * fStack_5a8 +
                 fStack_5a8 * fVar280 * fStack_668 + fVar283 * fStack_5a8 * fStack_868;
    fVar193 = fStack_a04 + fStack_664 + fStack_864;
    local_560 = fVar160 * fVar300 * local_5c0 +
                local_5c0 * fVar294 * fVar158 + fVar305 * fVar299 * local_5c0;
    fStack_55c = fVar188 * fVar183 * fStack_5bc +
                 fStack_5bc * fVar159 * fVar187 + fVar308 * fVar162 * fStack_5bc;
    fStack_558 = fVar216 * fVar191 * fStack_5b8 +
                 fStack_5b8 * fVar189 * fVar194 + fVar309 * fVar190 * fStack_5b8;
    fStack_554 = fVar224 * fVar221 * fStack_5b4 +
                 fStack_5b4 * fVar218 * fVar223 + fVar310 * fVar220 * fStack_5b4;
    fStack_550 = fVar248 * fVar245 * fStack_5b0 +
                 fStack_5b0 * fVar243 * fVar247 + fVar311 * fVar244 * fStack_5b0;
    fStack_54c = fVar277 * fVar268 * fStack_5ac +
                 fStack_5ac * fVar249 * fVar274 + fVar312 * fVar265 * fStack_5ac;
    fStack_548 = fVar363 * fVar12 * fStack_5a8 +
                 fStack_5a8 * fVar280 * fVar336 + fVar313 * fVar283 * fStack_5a8;
    fStack_544 = fStack_664 + fVar193;
    auVar32._4_4_ = fStack_53c * fStack_55c;
    auVar32._0_4_ = local_540 * local_560;
    auVar32._8_4_ = fStack_538 * fStack_558;
    auVar32._12_4_ = fStack_534 * fStack_554;
    auVar32._16_4_ = fStack_530 * fStack_550;
    auVar32._20_4_ = fStack_52c * fStack_54c;
    auVar32._24_4_ = fStack_528 * fStack_548;
    auVar32._28_4_ = fVar193;
    auVar207 = vsubps_avx(auVar327,auVar32);
    auVar33._4_4_ = fStack_55c * fStack_55c;
    auVar33._0_4_ = local_560 * local_560;
    auVar33._8_4_ = fStack_558 * fStack_558;
    auVar33._12_4_ = fStack_554 * fStack_554;
    auVar33._16_4_ = fStack_550 * fStack_550;
    auVar33._20_4_ = fStack_54c * fStack_54c;
    auVar33._24_4_ = fStack_548 * fStack_548;
    auVar33._28_4_ = fStack_664;
    local_620 = vsubps_avx(auVar341,auVar33);
    local_660 = vsqrtps_avx(auVar94);
    fVar193 = (local_660._0_4_ + auVar258._0_4_) * 1.0000002;
    fVar182 = (local_660._4_4_ + auVar258._4_4_) * 1.0000002;
    fVar215 = (local_660._8_4_ + auVar258._8_4_) * 1.0000002;
    fVar184 = (local_660._12_4_ + auVar258._12_4_) * 1.0000002;
    fVar217 = (local_660._16_4_ + auVar258._16_4_) * 1.0000002;
    fVar186 = (local_660._20_4_ + auVar258._20_4_) * 1.0000002;
    fVar219 = (local_660._24_4_ + auVar258._24_4_) * 1.0000002;
    auVar34._4_4_ = fVar182 * fVar182;
    auVar34._0_4_ = fVar193 * fVar193;
    auVar34._8_4_ = fVar215 * fVar215;
    auVar34._12_4_ = fVar184 * fVar184;
    auVar34._16_4_ = fVar217 * fVar217;
    auVar34._20_4_ = fVar186 * fVar186;
    auVar34._24_4_ = fVar219 * fVar219;
    auVar34._28_4_ = local_660._28_4_ + auVar258._28_4_;
    local_9a0._0_4_ = auVar207._0_4_ + auVar207._0_4_;
    local_9a0._4_4_ = auVar207._4_4_ + auVar207._4_4_;
    local_9a0._8_4_ = auVar207._8_4_ + auVar207._8_4_;
    local_9a0._12_4_ = auVar207._12_4_ + auVar207._12_4_;
    local_9a0._16_4_ = auVar207._16_4_ + auVar207._16_4_;
    local_9a0._20_4_ = auVar207._20_4_ + auVar207._20_4_;
    local_9a0._24_4_ = auVar207._24_4_ + auVar207._24_4_;
    fVar193 = auVar207._28_4_;
    local_9a0._28_4_ = fVar193 + fVar193;
    auVar258 = vsubps_avx(local_620,auVar34);
    auVar35._4_4_ = fStack_53c * fStack_53c;
    auVar35._0_4_ = local_540 * local_540;
    auVar35._8_4_ = fStack_538 * fStack_538;
    auVar35._12_4_ = fStack_534 * fStack_534;
    auVar35._16_4_ = fStack_530 * fStack_530;
    auVar35._20_4_ = fStack_52c * fStack_52c;
    auVar35._24_4_ = fStack_528 * fStack_528;
    auVar35._28_4_ = fVar193;
    auVar207 = vsubps_avx(local_2c0,auVar35);
    auVar36._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
    auVar36._0_4_ = (float)local_9a0._0_4_ * (float)local_9a0._0_4_;
    auVar36._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
    auVar36._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
    auVar36._16_4_ = local_9a0._16_4_ * local_9a0._16_4_;
    auVar36._20_4_ = local_9a0._20_4_ * local_9a0._20_4_;
    auVar36._24_4_ = local_9a0._24_4_ * local_9a0._24_4_;
    auVar36._28_4_ = local_2c0._28_4_;
    fVar193 = auVar207._0_4_;
    local_640._0_4_ = fVar193 * 4.0;
    fVar182 = auVar207._4_4_;
    local_640._4_4_ = fVar182 * 4.0;
    fVar215 = auVar207._8_4_;
    fStack_638 = fVar215 * 4.0;
    fVar184 = auVar207._12_4_;
    fStack_634 = fVar184 * 4.0;
    fVar217 = auVar207._16_4_;
    fStack_630 = fVar217 * 4.0;
    fVar186 = auVar207._20_4_;
    fStack_62c = fVar186 * 4.0;
    fVar219 = auVar207._24_4_;
    fStack_628 = fVar219 * 4.0;
    uStack_624 = 0x40800000;
    auVar37._4_4_ = auVar258._4_4_ * (float)local_640._4_4_;
    auVar37._0_4_ = auVar258._0_4_ * (float)local_640._0_4_;
    auVar37._8_4_ = auVar258._8_4_ * fStack_638;
    auVar37._12_4_ = auVar258._12_4_ * fStack_634;
    auVar37._16_4_ = auVar258._16_4_ * fStack_630;
    auVar37._20_4_ = auVar258._20_4_ * fStack_62c;
    auVar37._24_4_ = auVar258._24_4_ * fStack_628;
    auVar37._28_4_ = 0x40800000;
    auVar19 = vsubps_avx(auVar36,auVar37);
    auVar94 = vcmpps_avx(auVar19,auVar208,5);
    auVar291._8_4_ = 0x7fffffff;
    auVar291._0_8_ = 0x7fffffff7fffffff;
    auVar291._12_4_ = 0x7fffffff;
    auVar291._16_4_ = 0x7fffffff;
    auVar291._20_4_ = 0x7fffffff;
    auVar291._24_4_ = 0x7fffffff;
    auVar291._28_4_ = 0x7fffffff;
    local_420 = vandps_avx(auVar35,auVar291);
    local_340._0_4_ = fVar193 + fVar193;
    local_340._4_4_ = fVar182 + fVar182;
    local_340._8_4_ = fVar215 + fVar215;
    local_340._12_4_ = fVar184 + fVar184;
    local_340._16_4_ = fVar217 + fVar217;
    local_340._20_4_ = fVar186 + fVar186;
    local_340._24_4_ = fVar219 + fVar219;
    local_340._28_4_ = auVar207._28_4_ + auVar207._28_4_;
    local_440 = vandps_avx(auVar207,auVar291);
    uVar72 = CONCAT44(local_9a0._4_4_,local_9a0._0_4_);
    local_320._0_8_ = uVar72 ^ 0x8000000080000000;
    local_320._8_4_ = -local_9a0._8_4_;
    local_320._12_4_ = -local_9a0._12_4_;
    local_320._16_4_ = -local_9a0._16_4_;
    local_320._20_4_ = -local_9a0._20_4_;
    local_320._24_4_ = -local_9a0._24_4_;
    local_320._28_4_ = -local_9a0._28_4_;
    fStack_524 = fStack_a04 + fStack_664 + fStack_864;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar357._8_4_ = 0x7f800000;
      auVar357._0_8_ = 0x7f8000007f800000;
      auVar357._12_4_ = 0x7f800000;
      auVar357._16_4_ = 0x7f800000;
      auVar357._20_4_ = 0x7f800000;
      auVar357._24_4_ = 0x7f800000;
      auVar357._28_4_ = 0x7f800000;
      auVar152._8_4_ = 0xff800000;
      auVar152._0_8_ = 0xff800000ff800000;
      auVar152._12_4_ = 0xff800000;
      auVar152._16_4_ = 0xff800000;
      auVar152._20_4_ = 0xff800000;
      auVar152._24_4_ = 0xff800000;
      auVar152._28_4_ = 0xff800000;
    }
    else {
      auVar21 = vsqrtps_avx(auVar19);
      auVar20 = vrcpps_avx(local_340);
      auVar207 = vcmpps_avx(auVar19,auVar208,5);
      fVar193 = auVar20._0_4_;
      fVar182 = auVar20._4_4_;
      auVar38._4_4_ = local_340._4_4_ * fVar182;
      auVar38._0_4_ = local_340._0_4_ * fVar193;
      fVar215 = auVar20._8_4_;
      auVar38._8_4_ = local_340._8_4_ * fVar215;
      fVar184 = auVar20._12_4_;
      auVar38._12_4_ = local_340._12_4_ * fVar184;
      fVar217 = auVar20._16_4_;
      auVar38._16_4_ = local_340._16_4_ * fVar217;
      fVar186 = auVar20._20_4_;
      auVar38._20_4_ = local_340._20_4_ * fVar186;
      fVar219 = auVar20._24_4_;
      auVar38._24_4_ = local_340._24_4_ * fVar219;
      auVar38._28_4_ = auVar19._28_4_;
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar98._16_4_ = 0x3f800000;
      auVar98._20_4_ = 0x3f800000;
      auVar98._24_4_ = 0x3f800000;
      auVar98._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar98,auVar38);
      fVar193 = fVar193 + fVar193 * auVar19._0_4_;
      fVar182 = fVar182 + fVar182 * auVar19._4_4_;
      fVar215 = fVar215 + fVar215 * auVar19._8_4_;
      fVar184 = fVar184 + fVar184 * auVar19._12_4_;
      fVar217 = fVar217 + fVar217 * auVar19._16_4_;
      fVar186 = fVar186 + fVar186 * auVar19._20_4_;
      fVar219 = fVar219 + fVar219 * auVar19._24_4_;
      auVar208 = vsubps_avx(local_320,auVar21);
      fVar251 = auVar208._0_4_ * fVar193;
      fVar267 = auVar208._4_4_ * fVar182;
      auVar39._4_4_ = fVar267;
      auVar39._0_4_ = fVar251;
      fVar270 = auVar208._8_4_ * fVar215;
      auVar39._8_4_ = fVar270;
      fVar273 = auVar208._12_4_ * fVar184;
      auVar39._12_4_ = fVar273;
      fVar276 = auVar208._16_4_ * fVar217;
      auVar39._16_4_ = fVar276;
      fVar279 = auVar208._20_4_ * fVar186;
      auVar39._20_4_ = fVar279;
      fVar282 = auVar208._24_4_ * fVar219;
      auVar39._24_4_ = fVar282;
      auVar39._28_4_ = auVar208._28_4_;
      auVar208 = vsubps_avx(auVar21,local_9a0);
      fVar193 = auVar208._0_4_ * fVar193;
      fVar182 = auVar208._4_4_ * fVar182;
      auVar40._4_4_ = fVar182;
      auVar40._0_4_ = fVar193;
      fVar215 = auVar208._8_4_ * fVar215;
      auVar40._8_4_ = fVar215;
      fVar184 = auVar208._12_4_ * fVar184;
      auVar40._12_4_ = fVar184;
      fVar217 = auVar208._16_4_ * fVar217;
      auVar40._16_4_ = fVar217;
      fVar186 = auVar208._20_4_ * fVar186;
      auVar40._20_4_ = fVar186;
      fVar219 = auVar208._24_4_ * fVar219;
      auVar40._24_4_ = fVar219;
      auVar40._28_4_ = auVar20._28_4_ + auVar19._28_4_;
      local_3e0 = local_5c0 * (local_560 + local_540 * fVar251);
      fStack_3dc = fStack_5bc * (fStack_55c + fStack_53c * fVar267);
      fStack_3d8 = fStack_5b8 * (fStack_558 + fStack_538 * fVar270);
      fStack_3d4 = fStack_5b4 * (fStack_554 + fStack_534 * fVar273);
      fStack_3d0 = fStack_5b0 * (fStack_550 + fStack_530 * fVar276);
      fStack_3cc = fStack_5ac * (fStack_54c + fStack_52c * fVar279);
      fStack_3c8 = fStack_5a8 * (fStack_548 + fStack_528 * fVar282);
      uStack_3c4 = 0x3f800000;
      local_400 = local_5c0 * (local_560 + local_540 * fVar193);
      fStack_3fc = fStack_5bc * (fStack_55c + fStack_53c * fVar182);
      fStack_3f8 = fStack_5b8 * (fStack_558 + fStack_538 * fVar215);
      fStack_3f4 = fStack_5b4 * (fStack_554 + fStack_534 * fVar184);
      fStack_3f0 = fStack_5b0 * (fStack_550 + fStack_530 * fVar217);
      fStack_3ec = fStack_5ac * (fStack_54c + fStack_52c * fVar186);
      fStack_3e8 = fStack_5a8 * (fStack_548 + fStack_528 * fVar219);
      uStack_3e4 = 0x3f800000;
      auVar235._8_4_ = 0x7f800000;
      auVar235._0_8_ = 0x7f8000007f800000;
      auVar235._12_4_ = 0x7f800000;
      auVar235._16_4_ = 0x7f800000;
      auVar235._20_4_ = 0x7f800000;
      auVar235._24_4_ = 0x7f800000;
      auVar235._28_4_ = 0x7f800000;
      auVar357 = vblendvps_avx(auVar235,auVar39,auVar207);
      auVar236._8_4_ = 0xff800000;
      auVar236._0_8_ = 0xff800000ff800000;
      auVar236._12_4_ = 0xff800000;
      auVar236._16_4_ = 0xff800000;
      auVar236._20_4_ = 0xff800000;
      auVar236._24_4_ = 0xff800000;
      auVar236._28_4_ = 0xff800000;
      auVar152 = vblendvps_avx(auVar236,auVar40,auVar207);
      auVar19 = vmaxps_avx(local_5a0,local_420);
      auVar41._4_4_ = auVar19._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar19._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar19._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar19._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar19._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar19._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar19._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar19._28_4_;
      auVar19 = vcmpps_avx(local_440,auVar41,1);
      auVar208 = auVar207 & auVar19;
      if ((((((((auVar208 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar208 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar208 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar208 >> 0x7f,0) != '\0') ||
            (auVar208 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar208 >> 0xbf,0) != '\0') ||
          (auVar208 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar208[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar19,auVar207);
        auVar169 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar19 = vcmpps_avx(auVar258,_DAT_01f7b000,2);
        auVar214._8_4_ = 0xff800000;
        auVar214._0_8_ = 0xff800000ff800000;
        auVar214._12_4_ = 0xff800000;
        auVar214._16_4_ = 0xff800000;
        auVar214._20_4_ = 0xff800000;
        auVar214._24_4_ = 0xff800000;
        auVar214._28_4_ = 0xff800000;
        auVar328._8_4_ = 0x7f800000;
        auVar328._0_8_ = 0x7f8000007f800000;
        auVar328._12_4_ = 0x7f800000;
        auVar328._16_4_ = 0x7f800000;
        auVar328._20_4_ = 0x7f800000;
        auVar328._24_4_ = 0x7f800000;
        auVar328._28_4_ = 0x7f800000;
        auVar258 = vblendvps_avx(auVar328,auVar214,auVar19);
        auVar254 = vpmovsxwd_avx(auVar169);
        auVar169 = vpunpckhwd_avx(auVar169,auVar169);
        auVar263._16_16_ = auVar169;
        auVar263._0_16_ = auVar254;
        auVar357 = vblendvps_avx(auVar357,auVar258,auVar263);
        auVar258 = vblendvps_avx(auVar214,auVar328,auVar19);
        auVar152 = vblendvps_avx(auVar152,auVar258,auVar263);
        auVar242._0_8_ = auVar94._0_8_ ^ 0xffffffffffffffff;
        auVar242._8_4_ = auVar94._8_4_ ^ 0xffffffff;
        auVar242._12_4_ = auVar94._12_4_ ^ 0xffffffff;
        auVar242._16_4_ = auVar94._16_4_ ^ 0xffffffff;
        auVar242._20_4_ = auVar94._20_4_ ^ 0xffffffff;
        auVar242._24_4_ = auVar94._24_4_ ^ 0xffffffff;
        auVar242._28_4_ = auVar94._28_4_ ^ 0xffffffff;
        auVar94 = vorps_avx(auVar19,auVar242);
        auVar94 = vandps_avx(auVar207,auVar94);
      }
    }
    auVar361 = ZEXT3264(local_940);
    auVar258 = local_500 & auVar94;
    auVar264 = ZEXT3264(local_980);
    fVar251 = (float)local_8a0._0_4_;
    fVar267 = (float)local_8a0._4_4_;
    fVar270 = fStack_898;
    fVar273 = fStack_894;
    fVar276 = fStack_890;
    fVar279 = fStack_88c;
    fVar282 = fStack_888;
    fVar302 = fStack_884;
    fVar193 = (float)local_a40._0_4_;
    fVar182 = (float)local_a40._4_4_;
    fVar215 = fStack_a38;
    fVar184 = fStack_a34;
    fVar217 = fStack_a30;
    fVar186 = fStack_a2c;
    fVar219 = fStack_a28;
    if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar258 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar258 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar258 >> 0x7f,0) == '\0') &&
          (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar258 >> 0xbf,0) == '\0') &&
        (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar258[0x1f])
    {
      auVar329 = ZEXT3264(local_ac0);
    }
    else {
      fStack_5a4 = auVar95._28_4_ + auVar179._28_4_;
      auVar361 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar169 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar169 = vshufps_avx(auVar169,auVar169,0);
      auVar237._16_16_ = auVar169;
      auVar237._0_16_ = auVar169;
      auVar19 = vminps_avx(auVar237,auVar152);
      auVar99._0_4_ =
           (float)local_a20._0_4_ * fVar325 +
           (float)local_680._0_4_ * fVar314 + (float)local_880._0_4_ * fVar337;
      auVar99._4_4_ =
           (float)local_a20._4_4_ * fVar330 +
           (float)local_680._4_4_ * fVar319 + (float)local_880._4_4_ * fVar343;
      auVar99._8_4_ = fStack_a18 * fVar331 + fStack_678 * fVar320 + fStack_878 * fVar345;
      auVar99._12_4_ = fStack_a14 * fVar332 + fStack_674 * fVar321 + fStack_874 * fVar347;
      auVar99._16_4_ = fStack_a10 * fVar333 + fStack_670 * fVar322 + fStack_870 * fVar349;
      auVar99._20_4_ = fStack_a0c * fVar334 + fStack_66c * fVar323 + fStack_86c * fVar351;
      auVar99._24_4_ = fStack_a08 * fVar335 + fStack_668 * fVar324 + fStack_868 * fVar353;
      auVar99._28_4_ = fVar355 + auVar315._28_4_ + fVar355;
      auVar207 = vrcpps_avx(auVar99);
      fVar355 = auVar207._0_4_;
      fVar7 = auVar207._4_4_;
      auVar42._4_4_ = auVar99._4_4_ * fVar7;
      auVar42._0_4_ = auVar99._0_4_ * fVar355;
      fVar8 = auVar207._8_4_;
      auVar42._8_4_ = auVar99._8_4_ * fVar8;
      fVar9 = auVar207._12_4_;
      auVar42._12_4_ = auVar99._12_4_ * fVar9;
      fVar10 = auVar207._16_4_;
      auVar42._16_4_ = auVar99._16_4_ * fVar10;
      fVar11 = auVar207._20_4_;
      auVar42._20_4_ = auVar99._20_4_ * fVar11;
      fVar13 = auVar207._24_4_;
      auVar42._24_4_ = auVar99._24_4_ * fVar13;
      auVar42._28_4_ = local_ac0._28_4_ + auVar169._12_4_;
      auVar316._8_4_ = 0x3f800000;
      auVar316._0_8_ = 0x3f8000003f800000;
      auVar316._12_4_ = 0x3f800000;
      auVar316._16_4_ = 0x3f800000;
      auVar316._20_4_ = 0x3f800000;
      auVar316._24_4_ = 0x3f800000;
      auVar316._28_4_ = 0x3f800000;
      auVar208 = vsubps_avx(auVar316,auVar42);
      auVar260._8_4_ = 0x7fffffff;
      auVar260._0_8_ = 0x7fffffff7fffffff;
      auVar260._12_4_ = 0x7fffffff;
      auVar260._16_4_ = 0x7fffffff;
      auVar260._20_4_ = 0x7fffffff;
      auVar260._24_4_ = 0x7fffffff;
      auVar260._28_4_ = 0x7fffffff;
      auVar258 = vandps_avx(auVar99,auVar260);
      auVar342._8_4_ = 0x219392ef;
      auVar342._0_8_ = 0x219392ef219392ef;
      auVar342._12_4_ = 0x219392ef;
      auVar342._16_4_ = 0x219392ef;
      auVar342._20_4_ = 0x219392ef;
      auVar342._24_4_ = 0x219392ef;
      auVar342._28_4_ = 0x219392ef;
      auVar95 = vcmpps_avx(auVar258,auVar342,1);
      auVar43._4_4_ =
           (fVar7 + fVar7 * auVar208._4_4_) *
           -(fVar188 * fVar330 + fVar319 * fVar187 + fVar308 * fVar343);
      auVar43._0_4_ =
           (fVar355 + fVar355 * auVar208._0_4_) *
           -(fVar160 * fVar325 + fVar314 * fVar158 + fVar305 * fVar337);
      auVar43._8_4_ =
           (fVar8 + fVar8 * auVar208._8_4_) *
           -(fVar216 * fVar331 + fVar320 * fVar194 + fVar309 * fVar345);
      auVar43._12_4_ =
           (fVar9 + fVar9 * auVar208._12_4_) *
           -(fVar224 * fVar332 + fVar321 * fVar223 + fVar310 * fVar347);
      auVar43._16_4_ =
           (fVar10 + fVar10 * auVar208._16_4_) *
           -(fVar248 * fVar333 + fVar322 * fVar247 + fVar311 * fVar349);
      auVar43._20_4_ =
           (fVar11 + fVar11 * auVar208._20_4_) *
           -(fVar277 * fVar334 + fVar323 * fVar274 + fVar312 * fVar351);
      auVar43._24_4_ =
           (fVar13 + fVar13 * auVar208._24_4_) *
           -(fVar363 * fVar335 + fVar324 * fVar336 + fVar313 * fVar353);
      auVar43._28_4_ = auVar207._28_4_ + auVar208._28_4_;
      auVar207 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar258 = vcmpps_avx(auVar99,auVar207,1);
      auVar258 = vorps_avx(auVar95,auVar258);
      auVar304._8_4_ = 0xff800000;
      auVar304._0_8_ = 0xff800000ff800000;
      auVar304._12_4_ = 0xff800000;
      auVar304._16_4_ = 0xff800000;
      auVar304._20_4_ = 0xff800000;
      auVar304._24_4_ = 0xff800000;
      auVar304._28_4_ = 0xff800000;
      auVar258 = vblendvps_avx(auVar43,auVar304,auVar258);
      auVar207 = vcmpps_avx(auVar99,auVar207,6);
      auVar95 = vorps_avx(auVar95,auVar207);
      auVar307._8_4_ = 0x7f800000;
      auVar307._0_8_ = 0x7f8000007f800000;
      auVar307._12_4_ = 0x7f800000;
      auVar307._16_4_ = 0x7f800000;
      auVar307._20_4_ = 0x7f800000;
      auVar307._24_4_ = 0x7f800000;
      auVar307._28_4_ = 0x7f800000;
      auVar95 = vblendvps_avx(auVar43,auVar307,auVar95);
      auVar207 = vmaxps_avx(local_3c0,auVar357);
      auVar207 = vmaxps_avx(auVar207,auVar258);
      auVar19 = vminps_avx(auVar19,auVar95);
      auVar208 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar258 = vsubps_avx(auVar208,auVar131);
      auVar95 = vsubps_avx(auVar208,auVar289);
      auVar44._4_4_ = auVar95._4_4_ * -fVar106;
      auVar44._0_4_ = auVar95._0_4_ * -fVar78;
      auVar44._8_4_ = auVar95._8_4_ * -fVar108;
      auVar44._12_4_ = auVar95._12_4_ * -fVar110;
      auVar44._16_4_ = auVar95._16_4_ * -fVar111;
      auVar44._20_4_ = auVar95._20_4_ * -fVar112;
      auVar44._24_4_ = auVar95._24_4_ * -fVar113;
      auVar44._28_4_ = auVar95._28_4_;
      auVar45._4_4_ = fVar185 * auVar258._4_4_;
      auVar45._0_4_ = fVar301 * auVar258._0_4_;
      auVar45._8_4_ = fVar192 * auVar258._8_4_;
      auVar45._12_4_ = fVar222 * auVar258._12_4_;
      auVar45._16_4_ = fVar246 * auVar258._16_4_;
      auVar45._20_4_ = fVar271 * auVar258._20_4_;
      auVar45._24_4_ = fVar362 * auVar258._24_4_;
      auVar45._28_4_ = auVar258._28_4_;
      auVar258 = vsubps_avx(auVar44,auVar45);
      auVar95 = vsubps_avx(auVar208,auVar17);
      auVar46._4_4_ = fVar344 * auVar95._4_4_;
      auVar46._0_4_ = fVar338 * auVar95._0_4_;
      auVar46._8_4_ = fVar346 * auVar95._8_4_;
      auVar46._12_4_ = fVar348 * auVar95._12_4_;
      auVar46._16_4_ = fVar350 * auVar95._16_4_;
      auVar46._20_4_ = fVar352 * auVar95._20_4_;
      uVar75 = auVar95._28_4_;
      auVar46._24_4_ = fVar354 * auVar95._24_4_;
      auVar46._28_4_ = uVar75;
      auVar131 = vsubps_avx(auVar258,auVar46);
      auVar47._4_4_ = (float)local_880._4_4_ * -fVar106;
      auVar47._0_4_ = (float)local_880._0_4_ * -fVar78;
      auVar47._8_4_ = fStack_878 * -fVar108;
      auVar47._12_4_ = fStack_874 * -fVar110;
      auVar47._16_4_ = fStack_870 * -fVar111;
      auVar47._20_4_ = fStack_86c * -fVar112;
      auVar47._24_4_ = fStack_868 * -fVar113;
      auVar47._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar48._4_4_ = (float)local_680._4_4_ * fVar185;
      auVar48._0_4_ = (float)local_680._0_4_ * fVar301;
      auVar48._8_4_ = fStack_678 * fVar192;
      auVar48._12_4_ = fStack_674 * fVar222;
      auVar48._16_4_ = fStack_670 * fVar246;
      auVar48._20_4_ = fStack_66c * fVar271;
      auVar48._24_4_ = fStack_668 * fVar362;
      auVar48._28_4_ = uVar75;
      auVar258 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar344 * (float)local_a20._4_4_;
      auVar49._0_4_ = fVar338 * (float)local_a20._0_4_;
      auVar49._8_4_ = fVar346 * fStack_a18;
      auVar49._12_4_ = fVar348 * fStack_a14;
      auVar49._16_4_ = fVar350 * fStack_a10;
      auVar49._20_4_ = fVar352 * fStack_a0c;
      auVar49._24_4_ = fVar354 * fStack_a08;
      auVar49._28_4_ = uVar75;
      auVar289 = vsubps_avx(auVar258,auVar49);
      auVar258 = vrcpps_avx(auVar289);
      fVar301 = auVar258._0_4_;
      fVar158 = auVar258._4_4_;
      auVar50._4_4_ = auVar289._4_4_ * fVar158;
      auVar50._0_4_ = auVar289._0_4_ * fVar301;
      fVar160 = auVar258._8_4_;
      auVar50._8_4_ = auVar289._8_4_ * fVar160;
      fVar185 = auVar258._12_4_;
      auVar50._12_4_ = auVar289._12_4_ * fVar185;
      fVar187 = auVar258._16_4_;
      auVar50._16_4_ = auVar289._16_4_ * fVar187;
      fVar188 = auVar258._20_4_;
      auVar50._20_4_ = auVar289._20_4_ * fVar188;
      fVar192 = auVar258._24_4_;
      auVar50._24_4_ = auVar289._24_4_ * fVar192;
      auVar50._28_4_ = fStack_864;
      auVar17 = vsubps_avx(auVar316,auVar50);
      auVar258 = vandps_avx(auVar289,auVar260);
      auVar261._8_4_ = 0x219392ef;
      auVar261._0_8_ = 0x219392ef219392ef;
      auVar261._12_4_ = 0x219392ef;
      auVar261._16_4_ = 0x219392ef;
      auVar261._20_4_ = 0x219392ef;
      auVar261._24_4_ = 0x219392ef;
      auVar261._28_4_ = 0x219392ef;
      auVar95 = vcmpps_avx(auVar258,auVar261,1);
      auVar51._4_4_ = (fVar158 + fVar158 * auVar17._4_4_) * -auVar131._4_4_;
      auVar51._0_4_ = (fVar301 + fVar301 * auVar17._0_4_) * -auVar131._0_4_;
      auVar51._8_4_ = (fVar160 + fVar160 * auVar17._8_4_) * -auVar131._8_4_;
      auVar51._12_4_ = (fVar185 + fVar185 * auVar17._12_4_) * -auVar131._12_4_;
      auVar51._16_4_ = (fVar187 + fVar187 * auVar17._16_4_) * -auVar131._16_4_;
      auVar51._20_4_ = (fVar188 + fVar188 * auVar17._20_4_) * -auVar131._20_4_;
      auVar51._24_4_ = (fVar192 + fVar192 * auVar17._24_4_) * -auVar131._24_4_;
      auVar51._28_4_ = auVar131._28_4_ ^ 0x80000000;
      auVar258 = vcmpps_avx(auVar289,ZEXT832(0) << 0x20,1);
      auVar258 = vorps_avx(auVar95,auVar258);
      auVar258 = vblendvps_avx(auVar51,auVar304,auVar258);
      local_6a0 = vmaxps_avx(auVar207,auVar258);
      auVar258 = vcmpps_avx(auVar289,ZEXT832(0) << 0x20,6);
      auVar258 = vorps_avx(auVar95,auVar258);
      auVar258 = vblendvps_avx(auVar51,auVar307,auVar258);
      auVar94 = vandps_avx(local_500,auVar94);
      local_460 = vminps_avx(auVar19,auVar258);
      auVar258 = vcmpps_avx(local_6a0,local_460,2);
      auVar95 = auVar94 & auVar258;
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0x7f,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar95 >> 0xbf,0) != '\0') ||
          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar95[0x1f] < '\0') {
        auVar95 = vminps_avx(auVar259,local_600);
        auVar131 = vminps_avx(auVar16,auVar18);
        auVar95 = vminps_avx(auVar95,auVar131);
        auVar95 = vsubps_avx(auVar95,local_660);
        auVar94 = vandps_avx(auVar258,auVar94);
        auVar66._4_4_ = fStack_3dc;
        auVar66._0_4_ = local_3e0;
        auVar66._8_4_ = fStack_3d8;
        auVar66._12_4_ = fStack_3d4;
        auVar66._16_4_ = fStack_3d0;
        auVar66._20_4_ = fStack_3cc;
        auVar66._24_4_ = fStack_3c8;
        auVar66._28_4_ = uStack_3c4;
        auVar258 = vminps_avx(auVar66,auVar316);
        auVar205 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar258 = vmaxps_avx(auVar258,ZEXT832(0) << 0x20);
        fVar301 = DAT_01f7b060._28_4_;
        local_1a0[0] = fVar364 + fVar114 * (auVar258._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1a0[1] = fVar105 + fVar142 * (auVar258._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1a0[2] = fVar107 + fVar143 * (auVar258._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1a0[3] = fVar109 + fVar144 * (auVar258._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_190 = fVar364 + fVar114 * (auVar258._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_18c = fVar105 + fVar142 * (auVar258._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_188 = fVar107 + fVar143 * (auVar258._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_184 = fVar109 + auVar258._28_4_ + fVar301;
        auVar65._4_4_ = fStack_3fc;
        auVar65._0_4_ = local_400;
        auVar65._8_4_ = fStack_3f8;
        auVar65._12_4_ = fStack_3f4;
        auVar65._16_4_ = fStack_3f0;
        auVar65._20_4_ = fStack_3ec;
        auVar65._24_4_ = fStack_3e8;
        auVar65._28_4_ = uStack_3e4;
        auVar258 = vminps_avx(auVar65,auVar316);
        auVar258 = vmaxps_avx(auVar258,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar364 + fVar114 * (auVar258._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1c0[1] = fVar105 + fVar142 * (auVar258._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1c0[2] = fVar107 + fVar143 * (auVar258._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1c0[3] = fVar109 + fVar144 * (auVar258._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_1b0 = fVar364 + fVar114 * (auVar258._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_1ac = fVar105 + fVar142 * (auVar258._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_1a8 = fVar107 + fVar143 * (auVar258._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_1a4 = fVar109 + auVar258._28_4_ + fVar301;
        auVar52._4_4_ = auVar95._4_4_ * 0.99999976;
        auVar52._0_4_ = auVar95._0_4_ * 0.99999976;
        auVar52._8_4_ = auVar95._8_4_ * 0.99999976;
        auVar52._12_4_ = auVar95._12_4_ * 0.99999976;
        auVar52._16_4_ = auVar95._16_4_ * 0.99999976;
        auVar52._20_4_ = auVar95._20_4_ * 0.99999976;
        auVar52._24_4_ = auVar95._24_4_ * 0.99999976;
        auVar52._28_4_ = 0x3f7ffffc;
        auVar258 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
        auVar53._4_4_ = auVar258._4_4_ * auVar258._4_4_;
        auVar53._0_4_ = auVar258._0_4_ * auVar258._0_4_;
        auVar53._8_4_ = auVar258._8_4_ * auVar258._8_4_;
        auVar53._12_4_ = auVar258._12_4_ * auVar258._12_4_;
        auVar53._16_4_ = auVar258._16_4_ * auVar258._16_4_;
        auVar53._20_4_ = auVar258._20_4_ * auVar258._20_4_;
        auVar53._24_4_ = auVar258._24_4_ * auVar258._24_4_;
        auVar53._28_4_ = auVar258._28_4_;
        local_a80 = vsubps_avx(local_620,auVar53);
        auVar54._4_4_ = local_a80._4_4_ * (float)local_640._4_4_;
        auVar54._0_4_ = local_a80._0_4_ * (float)local_640._0_4_;
        auVar54._8_4_ = local_a80._8_4_ * fStack_638;
        auVar54._12_4_ = local_a80._12_4_ * fStack_634;
        auVar54._16_4_ = local_a80._16_4_ * fStack_630;
        auVar54._20_4_ = local_a80._20_4_ * fStack_62c;
        auVar54._24_4_ = local_a80._24_4_ * fStack_628;
        auVar54._28_4_ = auVar258._28_4_;
        auVar95 = vsubps_avx(auVar36,auVar54);
        auVar258 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
        if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar258 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar258 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar258 >> 0x7f,0) == '\0') &&
              (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar258 >> 0xbf,0) == '\0') &&
            (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar258[0x1f]) {
          auVar257 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar232 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar360 = ZEXT1228(ZEXT812(0)) << 0x20;
          _local_ae0 = ZEXT832(0) << 0x20;
          _local_c20 = local_ae0._0_28_;
          auVar292._8_4_ = 0x7f800000;
          auVar292._0_8_ = 0x7f8000007f800000;
          auVar292._12_4_ = 0x7f800000;
          auVar292._16_4_ = 0x7f800000;
          auVar292._20_4_ = 0x7f800000;
          auVar292._24_4_ = 0x7f800000;
          auVar292._28_4_ = 0x7f800000;
          auVar317._8_4_ = 0xff800000;
          auVar317._0_8_ = 0xff800000ff800000;
          auVar317._12_4_ = 0xff800000;
          auVar317._16_4_ = 0xff800000;
          auVar317._20_4_ = 0xff800000;
          auVar317._24_4_ = 0xff800000;
          auVar317._28_4_ = 0xff800000;
          local_a80 = auVar22;
        }
        else {
          auVar131 = vrcpps_avx(local_340);
          fVar158 = auVar131._0_4_;
          auVar209._0_4_ = local_340._0_4_ * fVar158;
          fVar160 = auVar131._4_4_;
          auVar209._4_4_ = local_340._4_4_ * fVar160;
          fVar185 = auVar131._8_4_;
          auVar209._8_4_ = local_340._8_4_ * fVar185;
          fVar187 = auVar131._12_4_;
          auVar209._12_4_ = local_340._12_4_ * fVar187;
          fVar188 = auVar131._16_4_;
          auVar209._16_4_ = local_340._16_4_ * fVar188;
          fVar192 = auVar131._20_4_;
          auVar209._20_4_ = local_340._20_4_ * fVar192;
          fVar194 = auVar131._24_4_;
          auVar209._24_4_ = local_340._24_4_ * fVar194;
          auVar209._28_4_ = 0;
          auVar16 = vsubps_avx(auVar316,auVar209);
          auVar289 = vsqrtps_avx(auVar95);
          fVar158 = fVar158 + fVar158 * auVar16._0_4_;
          fVar160 = fVar160 + fVar160 * auVar16._4_4_;
          fVar185 = fVar185 + fVar185 * auVar16._8_4_;
          fVar187 = fVar187 + fVar187 * auVar16._12_4_;
          fVar188 = fVar188 + fVar188 * auVar16._16_4_;
          fVar192 = fVar192 + fVar192 * auVar16._20_4_;
          fVar194 = fVar194 + fVar194 * auVar16._24_4_;
          auVar17 = vsubps_avx(local_320,auVar289);
          fVar271 = auVar17._0_4_ * fVar158;
          fVar274 = auVar17._4_4_ * fVar160;
          auVar55._4_4_ = fVar274;
          auVar55._0_4_ = fVar271;
          fVar277 = auVar17._8_4_ * fVar185;
          auVar55._8_4_ = fVar277;
          fVar362 = auVar17._12_4_ * fVar187;
          auVar55._12_4_ = fVar362;
          fVar336 = auVar17._16_4_ * fVar188;
          auVar55._16_4_ = fVar336;
          fVar363 = auVar17._20_4_ * fVar192;
          auVar55._20_4_ = fVar363;
          fVar364 = auVar17._24_4_ * fVar194;
          auVar55._24_4_ = fVar364;
          auVar55._28_4_ = fStack_664;
          auVar17 = vsubps_avx(auVar289,local_9a0);
          fVar158 = auVar17._0_4_ * fVar158;
          fVar160 = auVar17._4_4_ * fVar160;
          auVar56._4_4_ = fVar160;
          auVar56._0_4_ = fVar158;
          fVar185 = auVar17._8_4_ * fVar185;
          auVar56._8_4_ = fVar185;
          fVar187 = auVar17._12_4_ * fVar187;
          auVar56._12_4_ = fVar187;
          fVar188 = auVar17._16_4_ * fVar188;
          auVar56._16_4_ = fVar188;
          fVar192 = auVar17._20_4_ * fVar192;
          auVar56._20_4_ = fVar192;
          fVar194 = auVar17._24_4_ * fVar194;
          auVar56._24_4_ = fVar194;
          auVar56._28_4_ = fVar144;
          fVar216 = (fVar271 * local_540 + local_560) * local_5c0;
          fVar222 = (fVar274 * fStack_53c + fStack_55c) * fStack_5bc;
          fVar223 = (fVar277 * fStack_538 + fStack_558) * fStack_5b8;
          fVar224 = (fVar362 * fStack_534 + fStack_554) * fStack_5b4;
          fVar246 = (fVar336 * fStack_530 + fStack_550) * fStack_5b0;
          fVar247 = (fVar363 * fStack_52c + fStack_54c) * fStack_5ac;
          fVar248 = (fVar364 * fStack_528 + fStack_548) * fStack_5a8;
          auVar153._0_4_ = fVar250 + fVar216 * fVar300;
          auVar153._4_4_ = fVar266 + fVar222 * fVar183;
          auVar153._8_4_ = fVar269 + fVar223 * fVar191;
          auVar153._12_4_ = fVar272 + fVar224 * fVar221;
          auVar153._16_4_ = fVar275 + fVar246 * fVar245;
          auVar153._20_4_ = fVar278 + fVar247 * fVar268;
          auVar153._24_4_ = fVar281 + fVar248 * fVar12;
          auVar153._28_4_ = fVar284 + auVar131._28_4_ + auVar16._28_4_ + fStack_544;
          auVar57._4_4_ = fVar274 * (float)local_a20._4_4_;
          auVar57._0_4_ = fVar271 * (float)local_a20._0_4_;
          auVar57._8_4_ = fVar277 * fStack_a18;
          auVar57._12_4_ = fVar362 * fStack_a14;
          auVar57._16_4_ = fVar336 * fStack_a10;
          auVar57._20_4_ = fVar363 * fStack_a0c;
          auVar57._24_4_ = fVar364 * fStack_a08;
          auVar57._28_4_ = auVar289._28_4_;
          local_960 = vsubps_avx(auVar57,auVar153);
          auVar238._0_4_ = (float)local_a00._0_4_ + fVar216 * fVar294;
          auVar238._4_4_ = local_a00._4_4_ + fVar222 * fVar159;
          auVar238._8_4_ = local_a00._8_4_ + fVar223 * fVar189;
          auVar238._12_4_ = local_a00._12_4_ + fVar224 * fVar218;
          auVar238._16_4_ = local_a00._16_4_ + fVar246 * fVar243;
          auVar238._20_4_ = local_a00._20_4_ + fVar247 * fVar249;
          auVar238._24_4_ = local_a00._24_4_ + fVar248 * fVar280;
          auVar238._28_4_ = local_a00._28_4_ + auVar289._28_4_;
          auVar67._4_4_ = (float)local_680._4_4_ * fVar274;
          auVar67._0_4_ = (float)local_680._0_4_ * fVar271;
          auVar67._8_4_ = fStack_678 * fVar277;
          auVar67._12_4_ = fStack_674 * fVar362;
          auVar67._16_4_ = fStack_670 * fVar336;
          auVar67._20_4_ = fStack_66c * fVar363;
          auVar67._24_4_ = fStack_668 * fVar364;
          auVar67._28_4_ = fVar301;
          auVar131 = vsubps_avx(auVar67,auVar238);
          _local_c20 = auVar131._0_28_;
          auVar210._0_4_ = local_2e0._0_4_ + fVar299 * fVar216;
          auVar210._4_4_ = local_2e0._4_4_ + fVar162 * fVar222;
          auVar210._8_4_ = local_2e0._8_4_ + fVar190 * fVar223;
          auVar210._12_4_ = local_2e0._12_4_ + fVar220 * fVar224;
          auVar210._16_4_ = local_2e0._16_4_ + fVar244 * fVar246;
          auVar210._20_4_ = local_2e0._20_4_ + fVar265 * fVar247;
          auVar210._24_4_ = local_2e0._24_4_ + fVar283 * fVar248;
          auVar210._28_4_ = local_2e0._28_4_ + auVar17._28_4_;
          auVar58._4_4_ = fVar274 * (float)local_880._4_4_;
          auVar58._0_4_ = fVar271 * (float)local_880._0_4_;
          auVar58._8_4_ = fVar277 * fStack_878;
          auVar58._12_4_ = fVar362 * fStack_874;
          auVar58._16_4_ = fVar336 * fStack_870;
          auVar58._20_4_ = fVar363 * fStack_86c;
          auVar58._24_4_ = fVar364 * fStack_868;
          auVar58._28_4_ = auVar238._28_4_;
          _local_ae0 = vsubps_avx(auVar58,auVar210);
          fVar216 = (fVar158 * local_540 + local_560) * local_5c0;
          fVar222 = (fVar160 * fStack_53c + fStack_55c) * fStack_5bc;
          fVar223 = (fVar185 * fStack_538 + fStack_558) * fStack_5b8;
          fVar224 = (fVar187 * fStack_534 + fStack_554) * fStack_5b4;
          fVar246 = (fVar188 * fStack_530 + fStack_550) * fStack_5b0;
          fVar247 = (fVar192 * fStack_52c + fStack_54c) * fStack_5ac;
          fVar248 = (fVar194 * fStack_528 + fStack_548) * fStack_5a8;
          auVar211._0_4_ = fVar250 + fVar216 * fVar300;
          auVar211._4_4_ = fVar266 + fVar222 * fVar183;
          auVar211._8_4_ = fVar269 + fVar223 * fVar191;
          auVar211._12_4_ = fVar272 + fVar224 * fVar221;
          auVar211._16_4_ = fVar275 + fVar246 * fVar245;
          auVar211._20_4_ = fVar278 + fVar247 * fVar268;
          auVar211._24_4_ = fVar281 + fVar248 * fVar12;
          auVar211._28_4_ = fVar284 + local_ae0._28_4_ + fStack_544;
          auVar59._4_4_ = fVar160 * (float)local_a20._4_4_;
          auVar59._0_4_ = fVar158 * (float)local_a20._0_4_;
          auVar59._8_4_ = fVar185 * fStack_a18;
          auVar59._12_4_ = fVar187 * fStack_a14;
          auVar59._16_4_ = fVar188 * fStack_a10;
          auVar59._20_4_ = fVar192 * fStack_a0c;
          auVar59._24_4_ = fVar194 * fStack_a08;
          auVar59._28_4_ = fVar301;
          auVar131 = vsubps_avx(auVar59,auVar211);
          auVar205 = auVar131._0_28_;
          auVar262._0_4_ = (float)local_a00._0_4_ + fVar216 * fVar294;
          auVar262._4_4_ = local_a00._4_4_ + fVar222 * fVar159;
          auVar262._8_4_ = local_a00._8_4_ + fVar223 * fVar189;
          auVar262._12_4_ = local_a00._12_4_ + fVar224 * fVar218;
          auVar262._16_4_ = local_a00._16_4_ + fVar246 * fVar243;
          auVar262._20_4_ = local_a00._20_4_ + fVar247 * fVar249;
          auVar262._24_4_ = local_a00._24_4_ + fVar248 * fVar280;
          auVar262._28_4_ = local_a00._28_4_ + fVar301;
          auVar60._4_4_ = (float)local_680._4_4_ * fVar160;
          auVar60._0_4_ = (float)local_680._0_4_ * fVar158;
          auVar60._8_4_ = fStack_678 * fVar185;
          auVar60._12_4_ = fStack_674 * fVar187;
          auVar60._16_4_ = fStack_670 * fVar188;
          auVar60._20_4_ = fStack_66c * fVar192;
          auVar60._24_4_ = fStack_668 * fVar194;
          auVar60._28_4_ = fStack_a04;
          auVar131 = vsubps_avx(auVar60,auVar262);
          auVar257 = auVar131._0_28_;
          auVar239._0_4_ = local_2e0._0_4_ + fVar299 * fVar216;
          auVar239._4_4_ = local_2e0._4_4_ + fVar162 * fVar222;
          auVar239._8_4_ = local_2e0._8_4_ + fVar190 * fVar223;
          auVar239._12_4_ = local_2e0._12_4_ + fVar220 * fVar224;
          auVar239._16_4_ = local_2e0._16_4_ + fVar244 * fVar246;
          auVar239._20_4_ = local_2e0._20_4_ + fVar265 * fVar247;
          auVar239._24_4_ = local_2e0._24_4_ + fVar283 * fVar248;
          auVar239._28_4_ = local_2e0._28_4_ + auVar238._28_4_;
          auVar61._4_4_ = fVar160 * (float)local_880._4_4_;
          auVar61._0_4_ = fVar158 * (float)local_880._0_4_;
          auVar61._8_4_ = fVar185 * fStack_878;
          auVar61._12_4_ = fVar187 * fStack_874;
          auVar61._16_4_ = fVar188 * fStack_870;
          auVar61._20_4_ = fVar192 * fStack_86c;
          auVar61._24_4_ = fVar194 * fStack_868;
          auVar61._28_4_ = fStack_a04;
          auVar131 = vsubps_avx(auVar61,auVar239);
          auVar232 = auVar131._0_28_;
          auVar95 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
          auVar293._8_4_ = 0x7f800000;
          auVar293._0_8_ = 0x7f8000007f800000;
          auVar293._12_4_ = 0x7f800000;
          auVar293._16_4_ = 0x7f800000;
          auVar293._20_4_ = 0x7f800000;
          auVar293._24_4_ = 0x7f800000;
          auVar293._28_4_ = 0x7f800000;
          auVar292 = vblendvps_avx(auVar293,auVar55,auVar95);
          auVar131 = vmaxps_avx(local_5a0,local_420);
          auVar62._4_4_ = auVar131._4_4_ * 1.9073486e-06;
          auVar62._0_4_ = auVar131._0_4_ * 1.9073486e-06;
          auVar62._8_4_ = auVar131._8_4_ * 1.9073486e-06;
          auVar62._12_4_ = auVar131._12_4_ * 1.9073486e-06;
          auVar62._16_4_ = auVar131._16_4_ * 1.9073486e-06;
          auVar62._20_4_ = auVar131._20_4_ * 1.9073486e-06;
          auVar62._24_4_ = auVar131._24_4_ * 1.9073486e-06;
          auVar62._28_4_ = auVar131._28_4_;
          auVar131 = vcmpps_avx(local_440,auVar62,1);
          auVar318._8_4_ = 0xff800000;
          auVar318._0_8_ = 0xff800000ff800000;
          auVar318._12_4_ = 0xff800000;
          auVar318._16_4_ = 0xff800000;
          auVar318._20_4_ = 0xff800000;
          auVar318._24_4_ = 0xff800000;
          auVar318._28_4_ = 0xff800000;
          auVar317 = vblendvps_avx(auVar318,auVar56,auVar95);
          auVar289 = auVar95 & auVar131;
          if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar289 >> 0x7f,0) != '\0') ||
                (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar289 >> 0xbf,0) != '\0') ||
              (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar289[0x1f] < '\0') {
            auVar258 = vandps_avx(auVar131,auVar95);
            auVar169 = vpackssdw_avx(auVar258._0_16_,auVar258._16_16_);
            auVar289 = vcmpps_avx(local_a80,_DAT_01f7b000,2);
            auVar141._8_4_ = 0xff800000;
            auVar141._0_8_ = 0xff800000ff800000;
            auVar141._12_4_ = 0xff800000;
            auVar141._16_4_ = 0xff800000;
            auVar141._20_4_ = 0xff800000;
            auVar141._24_4_ = 0xff800000;
            auVar141._28_4_ = 0xff800000;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar131 = vblendvps_avx(auVar157,auVar141,auVar289);
            auVar254 = vpmovsxwd_avx(auVar169);
            auVar169 = vpunpckhwd_avx(auVar169,auVar169);
            auVar358._16_16_ = auVar169;
            auVar358._0_16_ = auVar254;
            auVar292 = vblendvps_avx(auVar292,auVar131,auVar358);
            auVar131 = vblendvps_avx(auVar141,auVar157,auVar289);
            auVar317 = vblendvps_avx(auVar317,auVar131,auVar358);
            auVar181._0_8_ = auVar258._0_8_ ^ 0xffffffffffffffff;
            auVar181._8_4_ = auVar258._8_4_ ^ 0xffffffff;
            auVar181._12_4_ = auVar258._12_4_ ^ 0xffffffff;
            auVar181._16_4_ = auVar258._16_4_ ^ 0xffffffff;
            auVar181._20_4_ = auVar258._20_4_ ^ 0xffffffff;
            auVar181._24_4_ = auVar258._24_4_ ^ 0xffffffff;
            auVar181._28_4_ = auVar258._28_4_ ^ 0xffffffff;
            auVar258 = vorps_avx(auVar289,auVar181);
            auVar258 = vandps_avx(auVar95,auVar258);
          }
          auVar360 = local_960._0_28_;
        }
        _local_4c0 = local_6a0;
        local_4a0 = vminps_avx(local_460,auVar292);
        _local_800 = vmaxps_avx(local_6a0,auVar317);
        _local_480 = _local_800;
        auVar95 = vcmpps_avx(local_6a0,local_4a0,2);
        local_600 = vandps_avx(auVar94,auVar95);
        auVar95 = vcmpps_avx(_local_800,local_460,2);
        local_840 = vandps_avx(auVar94,auVar95);
        auVar94 = vorps_avx(local_840,local_600);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          auStack_8b8 = auVar18._8_24_;
          auVar133._0_8_ = auVar258._0_8_ ^ 0xffffffffffffffff;
          auVar133._8_4_ = auVar258._8_4_ ^ 0xffffffff;
          auVar133._12_4_ = auVar258._12_4_ ^ 0xffffffff;
          auVar133._16_4_ = auVar258._16_4_ ^ 0xffffffff;
          auVar133._20_4_ = auVar258._20_4_ ^ 0xffffffff;
          auVar133._24_4_ = auVar258._24_4_ ^ 0xffffffff;
          fVar193 = auVar258._28_4_;
          auVar133._28_4_ = (uint)fVar193 ^ 0xffffffff;
          auVar101._0_4_ =
               (float)local_a20._0_4_ * auVar205._0_4_ +
               (float)local_680._0_4_ * auVar257._0_4_ + (float)local_880._0_4_ * auVar232._0_4_;
          auVar101._4_4_ =
               (float)local_a20._4_4_ * auVar205._4_4_ +
               (float)local_680._4_4_ * auVar257._4_4_ + (float)local_880._4_4_ * auVar232._4_4_;
          auVar101._8_4_ =
               fStack_a18 * auVar205._8_4_ +
               fStack_678 * auVar257._8_4_ + fStack_878 * auVar232._8_4_;
          auVar101._12_4_ =
               fStack_a14 * auVar205._12_4_ +
               fStack_674 * auVar257._12_4_ + fStack_874 * auVar232._12_4_;
          auVar101._16_4_ =
               fStack_a10 * auVar205._16_4_ +
               fStack_670 * auVar257._16_4_ + fStack_870 * auVar232._16_4_;
          auVar101._20_4_ =
               fStack_a0c * auVar205._20_4_ +
               fStack_66c * auVar257._20_4_ + fStack_86c * auVar232._20_4_;
          auVar101._24_4_ =
               fStack_a08 * auVar205._24_4_ +
               fStack_668 * auVar257._24_4_ + fStack_868 * auVar232._24_4_;
          auVar101._28_4_ = fVar193 + local_840._28_4_ + auVar94._28_4_;
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar212._16_4_ = 0x7fffffff;
          auVar212._20_4_ = 0x7fffffff;
          auVar212._24_4_ = 0x7fffffff;
          auVar212._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar101,auVar212);
          auVar240._8_4_ = 0x3e99999a;
          auVar240._0_8_ = 0x3e99999a3e99999a;
          auVar240._12_4_ = 0x3e99999a;
          auVar240._16_4_ = 0x3e99999a;
          auVar240._20_4_ = 0x3e99999a;
          auVar240._24_4_ = 0x3e99999a;
          auVar240._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar240,1);
          _local_640 = vorps_avx(auVar94,auVar133);
          auVar102._0_4_ =
               auVar360._0_4_ * (float)local_a20._0_4_ +
               (float)local_680._0_4_ * (float)local_c20._0_4_ +
               (float)local_880._0_4_ * (float)local_ae0._0_4_;
          auVar102._4_4_ =
               auVar360._4_4_ * (float)local_a20._4_4_ +
               (float)local_680._4_4_ * (float)local_c20._4_4_ +
               (float)local_880._4_4_ * (float)local_ae0._4_4_;
          auVar102._8_4_ =
               auVar360._8_4_ * fStack_a18 + fStack_678 * fStack_c18 + fStack_878 * fStack_ad8;
          auVar102._12_4_ =
               auVar360._12_4_ * fStack_a14 + fStack_674 * fStack_c14 + fStack_874 * fStack_ad4;
          auVar102._16_4_ =
               auVar360._16_4_ * fStack_a10 + fStack_670 * fStack_c10 + fStack_870 * fStack_ad0;
          auVar102._20_4_ =
               auVar360._20_4_ * fStack_a0c + fStack_66c * fStack_c0c + fStack_86c * fStack_acc;
          auVar102._24_4_ =
               auVar360._24_4_ * fStack_a08 + fStack_668 * fStack_c08 + fStack_868 * fStack_ac8;
          auVar102._28_4_ = local_640._28_4_ + local_600._28_4_ + fVar193;
          auVar94 = vandps_avx(auVar102,auVar212);
          auVar94 = vcmpps_avx(auVar94,auVar240,1);
          auVar94 = vorps_avx(auVar94,auVar133);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar155,auVar134,auVar94);
          local_660 = ZEXT432(local_c48);
          auVar254 = vpshufd_avx(ZEXT416(local_c48),0);
          auVar169 = vpcmpgtd_avx(auVar94._16_16_,auVar254);
          local_6c0._0_16_ = auVar254;
          auVar254 = vpcmpgtd_avx(auVar94._0_16_,auVar254);
          auVar135._16_16_ = auVar169;
          auVar135._0_16_ = auVar254;
          local_620 = vblendps_avx(ZEXT1632(auVar254),auVar135,0xf0);
          auVar94 = vandnps_avx(local_620,local_600);
          local_820._4_4_ = local_6a0._4_4_ + (float)local_8a0._4_4_;
          local_820._0_4_ = local_6a0._0_4_ + (float)local_8a0._0_4_;
          fStack_818 = local_6a0._8_4_ + fStack_898;
          fStack_814 = local_6a0._12_4_ + fStack_894;
          fStack_810 = local_6a0._16_4_ + fStack_890;
          fStack_80c = local_6a0._20_4_ + fStack_88c;
          fStack_808 = local_6a0._24_4_ + fStack_888;
          fStack_804 = local_6a0._28_4_ + fStack_884;
          while( true ) {
            local_4e0 = auVar94;
            local_b40 = auVar81._0_4_;
            fStack_b3c = auVar81._4_4_;
            fStack_b38 = auVar81._8_4_;
            fStack_b34 = auVar81._12_4_;
            local_b20 = auVar80._0_4_;
            fStack_b1c = auVar80._4_4_;
            fStack_b18 = auVar80._8_4_;
            fStack_b14 = auVar80._12_4_;
            local_b30 = auVar15._0_4_;
            fStack_b2c = auVar15._4_4_;
            fStack_b28 = auVar15._8_4_;
            fStack_b24 = auVar15._12_4_;
            local_b50 = auVar116._0_4_;
            fStack_b4c = auVar116._4_4_;
            fStack_b48 = auVar116._8_4_;
            fStack_b44 = auVar116._12_4_;
            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar94 >> 0x7f,0) == '\0') &&
                  (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0xbf,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar94[0x1f]) break;
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar258 = vblendvps_avx(auVar136,local_6a0,auVar94);
            auVar95 = vshufps_avx(auVar258,auVar258,0xb1);
            auVar95 = vminps_avx(auVar258,auVar95);
            auVar131 = vshufpd_avx(auVar95,auVar95,5);
            auVar95 = vminps_avx(auVar95,auVar131);
            auVar131 = vperm2f128_avx(auVar95,auVar95,1);
            auVar95 = vminps_avx(auVar95,auVar131);
            auVar258 = vcmpps_avx(auVar258,auVar95,0);
            auVar95 = auVar94 & auVar258;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar95 >> 0x7f,0) != '\0') ||
                  (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0xbf,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar95[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar258,auVar94);
            }
            uVar68 = vmovmskps_avx(auVar94);
            uVar76 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
              }
            }
            uVar72 = (ulong)uVar76;
            *(undefined4 *)(local_4e0 + uVar72 * 4) = 0;
            fVar193 = local_1a0[uVar72];
            uVar76 = *(uint *)(local_4c0 + uVar72 * 4);
            fVar182 = auVar117._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar182 = sqrtf((float)local_9c0._0_4_);
            }
            auVar254 = vminps_avx(auVar80,auVar81);
            auVar169 = vmaxps_avx(auVar80,auVar81);
            auVar79 = vminps_avx(auVar15,auVar116);
            auVar85 = vminps_avx(auVar254,auVar79);
            auVar254 = vmaxps_avx(auVar15,auVar116);
            auVar79 = vmaxps_avx(auVar169,auVar254);
            auVar165._8_4_ = 0x7fffffff;
            auVar165._0_8_ = 0x7fffffff7fffffff;
            auVar165._12_4_ = 0x7fffffff;
            auVar169 = vandps_avx(auVar85,auVar165);
            auVar254 = vandps_avx(auVar79,auVar165);
            auVar169 = vmaxps_avx(auVar169,auVar254);
            auVar254 = vmovshdup_avx(auVar169);
            auVar254 = vmaxss_avx(auVar254,auVar169);
            auVar169 = vshufpd_avx(auVar169,auVar169,1);
            auVar169 = vmaxss_avx(auVar169,auVar254);
            local_a00._0_4_ = auVar169._0_4_ * 1.9073486e-06;
            local_a80._0_4_ = fVar182 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar79,auVar79,0xff);
            auVar169 = vinsertps_avx(ZEXT416(uVar76),ZEXT416((uint)fVar193),0x10);
            auVar264 = ZEXT1664(auVar169);
            lVar71 = 5;
            do {
              do {
                bVar77 = lVar71 == 0;
                lVar71 = lVar71 + -1;
                if (bVar77) goto LAB_007dc765;
                auVar254 = auVar264._0_16_;
                auVar169 = vmovshdup_avx(auVar254);
                fVar159 = auVar169._0_4_;
                fVar217 = 1.0 - fVar159;
                auVar169 = vshufps_avx(auVar254,auVar254,0x55);
                fVar193 = auVar169._0_4_;
                fVar182 = auVar169._4_4_;
                fVar215 = auVar169._8_4_;
                fVar184 = auVar169._12_4_;
                auVar169 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
                fVar186 = auVar169._0_4_;
                fVar219 = auVar169._4_4_;
                fVar294 = auVar169._8_4_;
                fVar299 = auVar169._12_4_;
                fVar300 = local_b30 * fVar193 + local_b40 * fVar186;
                fVar301 = fStack_b2c * fVar182 + fStack_b3c * fVar219;
                fVar158 = fStack_b28 * fVar215 + fStack_b38 * fVar294;
                fVar160 = fStack_b24 * fVar184 + fStack_b34 * fVar299;
                auVar227._0_4_ =
                     fVar186 * (local_b40 * fVar193 + fVar186 * local_b20) + fVar193 * fVar300;
                auVar227._4_4_ =
                     fVar219 * (fStack_b3c * fVar182 + fVar219 * fStack_b1c) + fVar182 * fVar301;
                auVar227._8_4_ =
                     fVar294 * (fStack_b38 * fVar215 + fVar294 * fStack_b18) + fVar215 * fVar158;
                auVar227._12_4_ =
                     fVar299 * (fStack_b34 * fVar184 + fVar299 * fStack_b14) + fVar184 * fVar160;
                auVar166._0_4_ =
                     fVar186 * fVar300 + fVar193 * (fVar193 * local_b50 + local_b30 * fVar186);
                auVar166._4_4_ =
                     fVar219 * fVar301 + fVar182 * (fVar182 * fStack_b4c + fStack_b2c * fVar219);
                auVar166._8_4_ =
                     fVar294 * fVar158 + fVar215 * (fVar215 * fStack_b48 + fStack_b28 * fVar294);
                auVar166._12_4_ =
                     fVar299 * fVar160 + fVar184 * (fVar184 * fStack_b44 + fStack_b24 * fVar299);
                auVar169 = vshufps_avx(auVar254,auVar254,0);
                auVar119._0_4_ = auVar169._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar119._4_4_ = auVar169._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar119._8_4_ = auVar169._8_4_ * fStack_9a8 + 0.0;
                auVar119._12_4_ = auVar169._12_4_ * fStack_9a4 + 0.0;
                auVar84._0_4_ = fVar186 * auVar227._0_4_ + fVar193 * auVar166._0_4_;
                auVar84._4_4_ = fVar219 * auVar227._4_4_ + fVar182 * auVar166._4_4_;
                auVar84._8_4_ = fVar294 * auVar227._8_4_ + fVar215 * auVar166._8_4_;
                auVar84._12_4_ = fVar299 * auVar227._12_4_ + fVar184 * auVar166._12_4_;
                local_960._0_16_ = auVar84;
                auVar169 = vsubps_avx(auVar119,auVar84);
                _local_ae0 = auVar169;
                auVar169 = vdpps_avx(auVar169,auVar169,0x7f);
                fVar193 = auVar169._0_4_;
                if (fVar193 < 0.0) {
                  local_aa0._0_16_ = auVar166;
                  fVar182 = sqrtf(fVar193);
                  auVar264 = ZEXT1664(auVar254);
                  auVar166 = local_aa0._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar169,auVar169);
                  fVar182 = auVar79._0_4_;
                }
                auVar79 = vsubps_avx(auVar166,auVar227);
                auVar288._0_4_ = auVar79._0_4_ * 3.0;
                auVar288._4_4_ = auVar79._4_4_ * 3.0;
                auVar288._8_4_ = auVar79._8_4_ * 3.0;
                auVar288._12_4_ = auVar79._12_4_ * 3.0;
                auVar79 = vshufps_avx(ZEXT416((uint)(fVar159 * 6.0)),ZEXT416((uint)(fVar159 * 6.0)),
                                      0);
                auVar85 = ZEXT416((uint)((fVar217 - (fVar159 + fVar159)) * 6.0));
                auVar147 = vshufps_avx(auVar85,auVar85,0);
                auVar85 = ZEXT416((uint)((fVar159 - (fVar217 + fVar217)) * 6.0));
                auVar115 = vshufps_avx(auVar85,auVar85,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar217 * 6.0)),ZEXT416((uint)(fVar217 * 6.0))
                                       ,0);
                auVar85 = vdpps_avx(auVar288,auVar288,0x7f);
                auVar120._0_4_ =
                     auVar145._0_4_ * local_b20 +
                     auVar115._0_4_ * local_b40 +
                     auVar79._0_4_ * local_b50 + auVar147._0_4_ * local_b30;
                auVar120._4_4_ =
                     auVar145._4_4_ * fStack_b1c +
                     auVar115._4_4_ * fStack_b3c +
                     auVar79._4_4_ * fStack_b4c + auVar147._4_4_ * fStack_b2c;
                auVar120._8_4_ =
                     auVar145._8_4_ * fStack_b18 +
                     auVar115._8_4_ * fStack_b38 +
                     auVar79._8_4_ * fStack_b48 + auVar147._8_4_ * fStack_b28;
                auVar120._12_4_ =
                     auVar145._12_4_ * fStack_b14 +
                     auVar115._12_4_ * fStack_b34 +
                     auVar79._12_4_ * fStack_b44 + auVar147._12_4_ * fStack_b24;
                auVar79 = vblendps_avx(auVar85,_DAT_01f45a50,0xe);
                auVar147 = vrsqrtss_avx(auVar79,auVar79);
                fVar184 = auVar147._0_4_;
                fVar215 = auVar85._0_4_;
                auVar147 = vdpps_avx(auVar288,auVar120,0x7f);
                auVar115 = vshufps_avx(auVar85,auVar85,0);
                auVar121._0_4_ = auVar120._0_4_ * auVar115._0_4_;
                auVar121._4_4_ = auVar120._4_4_ * auVar115._4_4_;
                auVar121._8_4_ = auVar120._8_4_ * auVar115._8_4_;
                auVar121._12_4_ = auVar120._12_4_ * auVar115._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar197._0_4_ = auVar288._0_4_ * auVar147._0_4_;
                auVar197._4_4_ = auVar288._4_4_ * auVar147._4_4_;
                auVar197._8_4_ = auVar288._8_4_ * auVar147._8_4_;
                auVar197._12_4_ = auVar288._12_4_ * auVar147._12_4_;
                auVar145 = vsubps_avx(auVar121,auVar197);
                auVar147 = vrcpss_avx(auVar79,auVar79);
                auVar79 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                     ZEXT416((uint)(auVar264._0_4_ * (float)local_a80._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar215 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar72 = CONCAT44(auVar288._4_4_,auVar288._0_4_);
                auVar228._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar228._8_4_ = -auVar288._8_4_;
                auVar228._12_4_ = -auVar288._12_4_;
                auVar115 = ZEXT416((uint)(fVar184 * 1.5 +
                                         fVar215 * -0.5 * fVar184 * fVar184 * fVar184));
                auVar115 = vshufps_avx(auVar115,auVar115,0);
                auVar167._0_4_ = auVar115._0_4_ * auVar145._0_4_ * auVar147._0_4_;
                auVar167._4_4_ = auVar115._4_4_ * auVar145._4_4_ * auVar147._4_4_;
                auVar167._8_4_ = auVar115._8_4_ * auVar145._8_4_ * auVar147._8_4_;
                auVar167._12_4_ = auVar115._12_4_ * auVar145._12_4_ * auVar147._12_4_;
                auVar255._0_4_ = auVar288._0_4_ * auVar115._0_4_;
                auVar255._4_4_ = auVar288._4_4_ * auVar115._4_4_;
                auVar255._8_4_ = auVar288._8_4_ * auVar115._8_4_;
                auVar255._12_4_ = auVar288._12_4_ * auVar115._12_4_;
                if (fVar215 < 0.0) {
                  local_aa0._0_16_ = auVar228;
                  local_920._0_16_ = auVar255;
                  local_9e0._0_16_ = auVar167;
                  fVar215 = sqrtf(fVar215);
                  auVar167 = local_9e0._0_16_;
                  auVar228 = local_aa0._0_16_;
                  auVar255 = local_920._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar215 = auVar85._0_4_;
                }
                auVar85 = vdpps_avx(_local_ae0,auVar255,0x7f);
                fVar182 = ((float)local_a00._0_4_ / fVar215) * (fVar182 + 1.0) +
                          auVar79._0_4_ + fVar182 * (float)local_a00._0_4_;
                auVar147 = vdpps_avx(auVar228,auVar255,0x7f);
                auVar115 = vdpps_avx(_local_ae0,auVar167,0x7f);
                auVar145 = vdpps_avx(_local_9b0,auVar255,0x7f);
                auVar146 = vdpps_avx(_local_ae0,auVar228,0x7f);
                fVar215 = auVar147._0_4_ + auVar115._0_4_;
                fVar184 = auVar85._0_4_;
                auVar86._0_4_ = fVar184 * fVar184;
                auVar86._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar86._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar86._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar115 = vsubps_avx(auVar169,auVar86);
                auVar147 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar217 = auVar146._0_4_ - fVar184 * fVar215;
                fVar186 = auVar147._0_4_ - fVar184 * auVar145._0_4_;
                auVar147 = vrsqrtss_avx(auVar115,auVar115);
                fVar219 = auVar115._0_4_;
                fVar184 = auVar147._0_4_;
                fVar184 = fVar184 * 1.5 + fVar219 * -0.5 * fVar184 * fVar184 * fVar184;
                if (fVar219 < 0.0) {
                  local_aa0._0_4_ = fVar182;
                  local_920._0_16_ = auVar145;
                  local_9e0._0_16_ = ZEXT416((uint)fVar215);
                  local_7a0._0_4_ = fVar217;
                  local_9a0._0_4_ = fVar186;
                  local_7c0._0_4_ = fVar184;
                  fVar219 = sqrtf(fVar219);
                  fVar184 = (float)local_7c0._0_4_;
                  fVar217 = (float)local_7a0._0_4_;
                  fVar186 = (float)local_9a0._0_4_;
                  auVar145 = local_920._0_16_;
                  fVar182 = (float)local_aa0._0_4_;
                  auVar147 = local_9e0._0_16_;
                }
                else {
                  auVar147 = vsqrtss_avx(auVar115,auVar115);
                  fVar219 = auVar147._0_4_;
                  auVar147 = ZEXT416((uint)fVar215);
                }
                auVar146 = vpermilps_avx(local_960._0_16_,0xff);
                auVar91 = vshufps_avx(auVar288,auVar288,0xff);
                fVar215 = fVar217 * fVar184 - auVar91._0_4_;
                auVar198._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar229._0_4_ = -fVar215;
                auVar229._4_4_ = 0x80000000;
                auVar229._8_4_ = 0x80000000;
                auVar229._12_4_ = 0x80000000;
                auVar115 = vinsertps_avx(auVar229,ZEXT416((uint)(fVar186 * fVar184)),0x1c);
                auVar145 = vmovsldup_avx(ZEXT416((uint)(auVar147._0_4_ * fVar186 * fVar184 -
                                                       auVar145._0_4_ * fVar215)));
                auVar115 = vdivps_avx(auVar115,auVar145);
                auVar147 = vinsertps_avx(auVar147,auVar198,0x10);
                auVar147 = vdivps_avx(auVar147,auVar145);
                auVar145 = vmovsldup_avx(auVar85);
                auVar87 = ZEXT416((uint)(fVar219 - auVar146._0_4_));
                auVar146 = vmovsldup_avx(auVar87);
                auVar148._0_4_ = auVar145._0_4_ * auVar115._0_4_ + auVar146._0_4_ * auVar147._0_4_;
                auVar148._4_4_ = auVar145._4_4_ * auVar115._4_4_ + auVar146._4_4_ * auVar147._4_4_;
                auVar148._8_4_ = auVar145._8_4_ * auVar115._8_4_ + auVar146._8_4_ * auVar147._8_4_;
                auVar148._12_4_ =
                     auVar145._12_4_ * auVar115._12_4_ + auVar146._12_4_ * auVar147._12_4_;
                auVar147 = vsubps_avx(auVar254,auVar148);
                auVar264 = ZEXT1664(auVar147);
                auVar149._8_4_ = 0x7fffffff;
                auVar149._0_8_ = 0x7fffffff7fffffff;
                auVar149._12_4_ = 0x7fffffff;
                auVar254 = vandps_avx(auVar85,auVar149);
              } while (fVar182 <= auVar254._0_4_);
              auVar168._8_4_ = 0x7fffffff;
              auVar168._0_8_ = 0x7fffffff7fffffff;
              auVar168._12_4_ = 0x7fffffff;
              auVar254 = vandps_avx(auVar87,auVar168);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar79._0_4_ + fVar182 <=
                     auVar254._0_4_);
            fVar182 = auVar147._0_4_ + (float)local_8f0._0_4_;
            if ((fVar161 <= fVar182) &&
               (fVar215 = *(float *)(ray + k * 4 + 0x80), fVar182 <= fVar215)) {
              auVar254 = vmovshdup_avx(auVar147);
              fVar184 = auVar254._0_4_;
              if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
                auVar169 = vrsqrtss_avx(auVar169,auVar169);
                fVar217 = auVar169._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar74].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar169 = ZEXT416((uint)(fVar217 * 1.5 +
                                           fVar193 * -0.5 * fVar217 * fVar217 * fVar217));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar170._0_4_ = auVar169._0_4_ * (float)local_ae0._0_4_;
                  auVar170._4_4_ = auVar169._4_4_ * (float)local_ae0._4_4_;
                  auVar170._8_4_ = auVar169._8_4_ * fStack_ad8;
                  auVar170._12_4_ = auVar169._12_4_ * fStack_ad4;
                  auVar122._0_4_ = auVar288._0_4_ + auVar91._0_4_ * auVar170._0_4_;
                  auVar122._4_4_ = auVar288._4_4_ + auVar91._4_4_ * auVar170._4_4_;
                  auVar122._8_4_ = auVar288._8_4_ + auVar91._8_4_ * auVar170._8_4_;
                  auVar122._12_4_ = auVar288._12_4_ + auVar91._12_4_ * auVar170._12_4_;
                  auVar169 = vshufps_avx(auVar170,auVar170,0xc9);
                  auVar254 = vshufps_avx(auVar288,auVar288,0xc9);
                  auVar171._0_4_ = auVar254._0_4_ * auVar170._0_4_;
                  auVar171._4_4_ = auVar254._4_4_ * auVar170._4_4_;
                  auVar171._8_4_ = auVar254._8_4_ * auVar170._8_4_;
                  auVar171._12_4_ = auVar254._12_4_ * auVar170._12_4_;
                  auVar199._0_4_ = auVar288._0_4_ * auVar169._0_4_;
                  auVar199._4_4_ = auVar288._4_4_ * auVar169._4_4_;
                  auVar199._8_4_ = auVar288._8_4_ * auVar169._8_4_;
                  auVar199._12_4_ = auVar288._12_4_ * auVar169._12_4_;
                  auVar79 = vsubps_avx(auVar199,auVar171);
                  auVar169 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar254 = vshufps_avx(auVar122,auVar122,0xc9);
                  auVar200._0_4_ = auVar254._0_4_ * auVar169._0_4_;
                  auVar200._4_4_ = auVar254._4_4_ * auVar169._4_4_;
                  auVar200._8_4_ = auVar254._8_4_ * auVar169._8_4_;
                  auVar200._12_4_ = auVar254._12_4_ * auVar169._12_4_;
                  auVar169 = vshufps_avx(auVar79,auVar79,0xd2);
                  auVar123._0_4_ = auVar122._0_4_ * auVar169._0_4_;
                  auVar123._4_4_ = auVar122._4_4_ * auVar169._4_4_;
                  auVar123._8_4_ = auVar122._8_4_ * auVar169._8_4_;
                  auVar123._12_4_ = auVar122._12_4_ * auVar169._12_4_;
                  auVar169 = vsubps_avx(auVar200,auVar123);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar182;
                    uVar75 = vextractps_avx(auVar169,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar75;
                    uVar75 = vextractps_avx(auVar169,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar75;
                    *(int *)(ray + k * 4 + 0xe0) = auVar169._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar184;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar74;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar147,auVar147,0x55);
                    auVar254 = vshufps_avx(auVar169,auVar169,0x55);
                    auStack_750 = vshufps_avx(auVar169,auVar169,0xaa);
                    local_740 = vshufps_avx(auVar169,auVar169,0);
                    local_760 = (RTCHitN  [16])auVar254;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar76 = context->user->instPrimID[0];
                    auVar124._4_4_ = uVar76;
                    auVar124._0_4_ = uVar76;
                    auVar124._8_4_ = uVar76;
                    auVar124._12_4_ = uVar76;
                    auStack_6e0 = auVar124;
                    *(float *)(ray + k * 4 + 0x80) = fVar182;
                    local_860._0_16_ = *local_a48;
                    local_b10.valid = (int *)local_860;
                    local_b10.geometryUserPtr = pGVar3->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    auVar169 = *local_a48;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b10);
                      auVar361._8_56_ = extraout_var;
                      auVar361._0_8_ = extraout_XMM1_Qa;
                      auVar124 = auVar361._0_16_;
                      auVar169 = local_860._0_16_;
                    }
                    if (auVar169 == (undefined1  [16])0x0) {
                      auVar254 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar169 = vpcmpeqd_avx(auVar124,auVar124);
                      auVar254 = auVar254 ^ auVar169;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      auVar79 = vpcmpeqd_avx(auVar254,auVar254);
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_b10);
                        auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                        auVar169 = local_860._0_16_;
                      }
                      auVar85 = vpcmpeqd_avx(auVar169,_DAT_01f45a50);
                      auVar254 = auVar85 ^ auVar79;
                      if (auVar169 != (undefined1  [16])0x0) {
                        auVar85 = auVar85 ^ auVar79;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar169;
                        auVar169 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar169;
                      }
                    }
                    auVar88._8_8_ = 0x100000001;
                    auVar88._0_8_ = 0x100000001;
                    if ((auVar88 & auVar254) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar215;
                    }
                  }
                }
              }
            }
LAB_007dc765:
            uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar297._4_4_ = uVar75;
            auVar297._0_4_ = uVar75;
            auVar297._8_4_ = uVar75;
            auVar297._12_4_ = uVar75;
            auVar297._16_4_ = uVar75;
            auVar297._20_4_ = uVar75;
            auVar297._24_4_ = uVar75;
            auVar297._28_4_ = uVar75;
            auVar361 = ZEXT3264(auVar297);
            auVar94 = vcmpps_avx(_local_820,auVar297,2);
            auVar94 = vandps_avx(auVar94,local_4e0);
          }
          auVar103._0_4_ = (float)local_8a0._0_4_ + (float)local_800._0_4_;
          auVar103._4_4_ = (float)local_8a0._4_4_ + (float)local_800._4_4_;
          auVar103._8_4_ = fStack_898 + fStack_7f8;
          auVar103._12_4_ = fStack_894 + fStack_7f4;
          auVar103._16_4_ = fStack_890 + fStack_7f0;
          auVar103._20_4_ = fStack_88c + fStack_7ec;
          auVar103._24_4_ = fStack_888 + fStack_7e8;
          auVar103._28_4_ = fStack_884 + fStack_7e4;
          auVar169 = vshufps_avx(auVar361._0_16_,auVar361._0_16_,0);
          auVar137._16_16_ = auVar169;
          auVar137._0_16_ = auVar169;
          auVar94 = vcmpps_avx(auVar103,auVar137,2);
          _local_820 = vandps_avx(auVar94,local_840);
          auVar104._8_4_ = 3;
          auVar104._0_8_ = 0x300000003;
          auVar104._12_4_ = 3;
          auVar104._16_4_ = 3;
          auVar104._20_4_ = 3;
          auVar104._24_4_ = 3;
          auVar104._28_4_ = 3;
          auVar138._8_4_ = 2;
          auVar138._0_8_ = 0x200000002;
          auVar138._12_4_ = 2;
          auVar138._16_4_ = 2;
          auVar138._20_4_ = 2;
          auVar138._24_4_ = 2;
          auVar138._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar138,auVar104,_local_640);
          auVar169 = vpcmpgtd_avx(auVar94._16_16_,local_6c0._0_16_);
          auVar254 = vpshufd_avx(local_660._0_16_,0);
          auVar254 = vpcmpgtd_avx(auVar94._0_16_,auVar254);
          auVar139._16_16_ = auVar169;
          auVar139._0_16_ = auVar254;
          local_840 = vblendps_avx(ZEXT1632(auVar254),auVar139,0xf0);
          local_860 = vandnps_avx(local_840,_local_820);
          local_6a0 = _local_480;
          local_800._4_4_ = (float)local_8a0._4_4_ + (float)local_480._4_4_;
          local_800._0_4_ = (float)local_8a0._0_4_ + (float)local_480._0_4_;
          fStack_7f8 = fStack_898 + fStack_478;
          fStack_7f4 = fStack_894 + fStack_474;
          fStack_7f0 = fStack_890 + fStack_470;
          fStack_7ec = fStack_88c + fStack_46c;
          fStack_7e8 = fStack_888 + fStack_468;
          fStack_7e4 = fStack_884 + fStack_464;
          auVar329 = ZEXT3264(local_ac0);
          auVar264 = ZEXT3264(local_980);
          fVar193 = (float)local_a40._0_4_;
          fVar182 = (float)local_a40._4_4_;
          fVar215 = fStack_a38;
          fVar184 = fStack_a34;
          fVar217 = fStack_a30;
          fVar186 = fStack_a2c;
          fVar219 = fStack_a28;
          for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_860 >> 0x7f,0) != '\0') ||
                   (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0xbf,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar94,local_860)) {
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar94 = vblendvps_avx(auVar140,local_6a0,local_860);
            auVar258 = vshufps_avx(auVar94,auVar94,0xb1);
            auVar258 = vminps_avx(auVar94,auVar258);
            auVar95 = vshufpd_avx(auVar258,auVar258,5);
            auVar258 = vminps_avx(auVar258,auVar95);
            auVar95 = vperm2f128_avx(auVar258,auVar258,1);
            auVar258 = vminps_avx(auVar258,auVar95);
            auVar258 = vcmpps_avx(auVar94,auVar258,0);
            auVar95 = local_860 & auVar258;
            auVar94 = local_860;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar95 >> 0x7f,0) != '\0') ||
                  (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0xbf,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar95[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar258,local_860);
            }
            uVar68 = vmovmskps_avx(auVar94);
            uVar76 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
              }
            }
            uVar72 = (ulong)uVar76;
            *(undefined4 *)(local_860 + uVar72 * 4) = 0;
            fVar294 = local_1c0[uVar72];
            uVar76 = *(uint *)(local_460 + uVar72 * 4);
            fVar299 = auVar14._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar299 = sqrtf((float)local_9c0._0_4_);
              auVar264 = ZEXT3264(local_980);
              auVar329 = ZEXT3264(local_ac0);
              fVar193 = (float)local_a40._0_4_;
              fVar182 = (float)local_a40._4_4_;
              fVar215 = fStack_a38;
              fVar184 = fStack_a34;
              fVar217 = fStack_a30;
              fVar186 = fStack_a2c;
              fVar219 = fStack_a28;
            }
            auVar254 = vminps_avx(auVar80,auVar81);
            auVar169 = vmaxps_avx(auVar80,auVar81);
            auVar79 = vminps_avx(auVar15,auVar116);
            auVar85 = vminps_avx(auVar254,auVar79);
            auVar254 = vmaxps_avx(auVar15,auVar116);
            auVar79 = vmaxps_avx(auVar169,auVar254);
            auVar172._8_4_ = 0x7fffffff;
            auVar172._0_8_ = 0x7fffffff7fffffff;
            auVar172._12_4_ = 0x7fffffff;
            auVar169 = vandps_avx(auVar85,auVar172);
            auVar254 = vandps_avx(auVar79,auVar172);
            auVar169 = vmaxps_avx(auVar169,auVar254);
            auVar254 = vmovshdup_avx(auVar169);
            auVar254 = vmaxss_avx(auVar254,auVar169);
            auVar169 = vshufpd_avx(auVar169,auVar169,1);
            auVar169 = vmaxss_avx(auVar169,auVar254);
            local_a00._0_4_ = auVar169._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar299 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar79,auVar79,0xff);
            auVar169 = vinsertps_avx(ZEXT416(uVar76),ZEXT416((uint)fVar294),0x10);
            auVar361 = ZEXT1664(auVar169);
            lVar71 = 5;
            do {
              do {
                bVar77 = lVar71 == 0;
                lVar71 = lVar71 + -1;
                if (bVar77) goto LAB_007dd2d8;
                auVar254 = auVar361._0_16_;
                auVar169 = vmovshdup_avx(auVar254);
                fVar159 = auVar169._0_4_;
                fVar217 = 1.0 - fVar159;
                auVar169 = vshufps_avx(auVar254,auVar254,0x55);
                fVar193 = auVar169._0_4_;
                fVar182 = auVar169._4_4_;
                fVar215 = auVar169._8_4_;
                fVar184 = auVar169._12_4_;
                auVar169 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
                fVar186 = auVar169._0_4_;
                fVar219 = auVar169._4_4_;
                fVar294 = auVar169._8_4_;
                fVar299 = auVar169._12_4_;
                fVar300 = local_b30 * fVar193 + local_b40 * fVar186;
                fVar301 = fStack_b2c * fVar182 + fStack_b3c * fVar219;
                fVar158 = fStack_b28 * fVar215 + fStack_b38 * fVar294;
                fVar160 = fStack_b24 * fVar184 + fStack_b34 * fVar299;
                auVar230._0_4_ =
                     fVar186 * (local_b40 * fVar193 + fVar186 * local_b20) + fVar193 * fVar300;
                auVar230._4_4_ =
                     fVar219 * (fStack_b3c * fVar182 + fVar219 * fStack_b1c) + fVar182 * fVar301;
                auVar230._8_4_ =
                     fVar294 * (fStack_b38 * fVar215 + fVar294 * fStack_b18) + fVar215 * fVar158;
                auVar230._12_4_ =
                     fVar299 * (fStack_b34 * fVar184 + fVar299 * fStack_b14) + fVar184 * fVar160;
                auVar173._0_4_ =
                     fVar186 * fVar300 + fVar193 * (fVar193 * local_b50 + local_b30 * fVar186);
                auVar173._4_4_ =
                     fVar219 * fVar301 + fVar182 * (fVar182 * fStack_b4c + fStack_b2c * fVar219);
                auVar173._8_4_ =
                     fVar294 * fVar158 + fVar215 * (fVar215 * fStack_b48 + fStack_b28 * fVar294);
                auVar173._12_4_ =
                     fVar299 * fVar160 + fVar184 * (fVar184 * fStack_b44 + fStack_b24 * fVar299);
                auVar169 = vshufps_avx(auVar254,auVar254,0);
                auVar125._0_4_ = auVar169._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar125._4_4_ = auVar169._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar125._8_4_ = auVar169._8_4_ * fStack_9a8 + 0.0;
                auVar125._12_4_ = auVar169._12_4_ * fStack_9a4 + 0.0;
                auVar89._0_4_ = fVar186 * auVar230._0_4_ + fVar193 * auVar173._0_4_;
                auVar89._4_4_ = fVar219 * auVar230._4_4_ + fVar182 * auVar173._4_4_;
                auVar89._8_4_ = fVar294 * auVar230._8_4_ + fVar215 * auVar173._8_4_;
                auVar89._12_4_ = fVar299 * auVar230._12_4_ + fVar184 * auVar173._12_4_;
                local_960._0_16_ = auVar89;
                auVar169 = vsubps_avx(auVar125,auVar89);
                _local_ae0 = auVar169;
                auVar169 = vdpps_avx(auVar169,auVar169,0x7f);
                fVar294 = auVar169._0_4_;
                if (fVar294 < 0.0) {
                  local_a80._0_16_ = auVar230;
                  fVar193 = sqrtf(fVar294);
                  auVar361 = ZEXT1664(auVar254);
                  auVar230 = local_a80._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar169,auVar169);
                  fVar193 = auVar79._0_4_;
                }
                auVar79 = vsubps_avx(auVar173,auVar230);
                auVar256._0_4_ = auVar79._0_4_ * 3.0;
                auVar256._4_4_ = auVar79._4_4_ * 3.0;
                auVar256._8_4_ = auVar79._8_4_ * 3.0;
                auVar256._12_4_ = auVar79._12_4_ * 3.0;
                auVar79 = vshufps_avx(ZEXT416((uint)(fVar159 * 6.0)),ZEXT416((uint)(fVar159 * 6.0)),
                                      0);
                auVar85 = ZEXT416((uint)((fVar217 - (fVar159 + fVar159)) * 6.0));
                auVar147 = vshufps_avx(auVar85,auVar85,0);
                auVar85 = ZEXT416((uint)((fVar159 - (fVar217 + fVar217)) * 6.0));
                auVar115 = vshufps_avx(auVar85,auVar85,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar217 * 6.0)),ZEXT416((uint)(fVar217 * 6.0))
                                       ,0);
                auVar85 = vdpps_avx(auVar256,auVar256,0x7f);
                auVar126._0_4_ =
                     auVar145._0_4_ * local_b20 +
                     auVar115._0_4_ * local_b40 +
                     auVar79._0_4_ * local_b50 + auVar147._0_4_ * local_b30;
                auVar126._4_4_ =
                     auVar145._4_4_ * fStack_b1c +
                     auVar115._4_4_ * fStack_b3c +
                     auVar79._4_4_ * fStack_b4c + auVar147._4_4_ * fStack_b2c;
                auVar126._8_4_ =
                     auVar145._8_4_ * fStack_b18 +
                     auVar115._8_4_ * fStack_b38 +
                     auVar79._8_4_ * fStack_b48 + auVar147._8_4_ * fStack_b28;
                auVar126._12_4_ =
                     auVar145._12_4_ * fStack_b14 +
                     auVar115._12_4_ * fStack_b34 +
                     auVar79._12_4_ * fStack_b44 + auVar147._12_4_ * fStack_b24;
                auVar79 = vblendps_avx(auVar85,_DAT_01f45a50,0xe);
                auVar147 = vrsqrtss_avx(auVar79,auVar79);
                fVar215 = auVar147._0_4_;
                fVar182 = auVar85._0_4_;
                auVar147 = vdpps_avx(auVar256,auVar126,0x7f);
                auVar115 = vshufps_avx(auVar85,auVar85,0);
                auVar127._0_4_ = auVar126._0_4_ * auVar115._0_4_;
                auVar127._4_4_ = auVar126._4_4_ * auVar115._4_4_;
                auVar127._8_4_ = auVar126._8_4_ * auVar115._8_4_;
                auVar127._12_4_ = auVar126._12_4_ * auVar115._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar201._0_4_ = auVar256._0_4_ * auVar147._0_4_;
                auVar201._4_4_ = auVar256._4_4_ * auVar147._4_4_;
                auVar201._8_4_ = auVar256._8_4_ * auVar147._8_4_;
                auVar201._12_4_ = auVar256._12_4_ * auVar147._12_4_;
                auVar145 = vsubps_avx(auVar127,auVar201);
                auVar147 = vrcpss_avx(auVar79,auVar79);
                auVar79 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                     ZEXT416((uint)(auVar361._0_4_ * (float)local_920._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar182 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar72 = CONCAT44(auVar256._4_4_,auVar256._0_4_);
                auVar295._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar295._8_4_ = -auVar256._8_4_;
                auVar295._12_4_ = -auVar256._12_4_;
                auVar115 = ZEXT416((uint)(fVar215 * 1.5 +
                                         fVar182 * -0.5 * fVar215 * fVar215 * fVar215));
                auVar115 = vshufps_avx(auVar115,auVar115,0);
                auVar174._0_4_ = auVar115._0_4_ * auVar145._0_4_ * auVar147._0_4_;
                auVar174._4_4_ = auVar115._4_4_ * auVar145._4_4_ * auVar147._4_4_;
                auVar174._8_4_ = auVar115._8_4_ * auVar145._8_4_ * auVar147._8_4_;
                auVar174._12_4_ = auVar115._12_4_ * auVar145._12_4_ * auVar147._12_4_;
                local_aa0._0_4_ = auVar256._0_4_ * auVar115._0_4_;
                local_aa0._4_4_ = auVar256._4_4_ * auVar115._4_4_;
                local_aa0._8_4_ = auVar256._8_4_ * auVar115._8_4_;
                local_aa0._12_4_ = auVar256._12_4_ * auVar115._12_4_;
                if (fVar182 < 0.0) {
                  local_a80._0_4_ = fVar193;
                  local_9e0._0_16_ = auVar174;
                  fVar182 = sqrtf(fVar182);
                  auVar174 = local_9e0._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar182 = auVar85._0_4_;
                  local_a80._0_4_ = fVar193;
                }
                auVar85 = vdpps_avx(_local_ae0,local_aa0._0_16_,0x7f);
                fVar299 = ((float)local_a00._0_4_ / fVar182) * ((float)local_a80._0_4_ + 1.0) +
                          auVar79._0_4_ + (float)local_a80._0_4_ * (float)local_a00._0_4_;
                auVar147 = vdpps_avx(auVar295,local_aa0._0_16_,0x7f);
                auVar115 = vdpps_avx(_local_ae0,auVar174,0x7f);
                auVar145 = vdpps_avx(_local_9b0,local_aa0._0_16_,0x7f);
                auVar146 = vdpps_avx(_local_ae0,auVar295,0x7f);
                fVar193 = auVar147._0_4_ + auVar115._0_4_;
                fVar182 = auVar85._0_4_;
                auVar90._0_4_ = fVar182 * fVar182;
                auVar90._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar90._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar90._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar115 = vsubps_avx(auVar169,auVar90);
                local_aa0._0_16_ = ZEXT416((uint)fVar193);
                auVar147 = vdpps_avx(_local_ae0,_local_9b0,0x7f);
                fVar215 = auVar146._0_4_ - fVar182 * fVar193;
                local_a80._0_16_ = auVar85;
                fVar182 = auVar147._0_4_ - fVar182 * auVar145._0_4_;
                auVar85 = vrsqrtss_avx(auVar115,auVar115);
                fVar184 = auVar115._0_4_;
                fVar193 = auVar85._0_4_;
                fVar193 = fVar193 * 1.5 + fVar184 * -0.5 * fVar193 * fVar193 * fVar193;
                if (fVar184 < 0.0) {
                  local_9e0._0_16_ = auVar145;
                  local_7a0._0_4_ = fVar215;
                  local_9a0._0_4_ = fVar182;
                  local_7c0._0_4_ = fVar193;
                  fVar184 = sqrtf(fVar184);
                  fVar193 = (float)local_7c0._0_4_;
                  fVar215 = (float)local_7a0._0_4_;
                  fVar182 = (float)local_9a0._0_4_;
                  auVar145 = local_9e0._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar115,auVar115);
                  fVar184 = auVar85._0_4_;
                }
                auVar329 = ZEXT3264(local_ac0);
                auVar91 = vpermilps_avx(local_960._0_16_,0xff);
                auVar146 = vshufps_avx(auVar256,auVar256,0xff);
                fVar215 = fVar215 * fVar193 - auVar146._0_4_;
                auVar202._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar202._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar202._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar231._0_4_ = -fVar215;
                auVar231._4_4_ = 0x80000000;
                auVar231._8_4_ = 0x80000000;
                auVar231._12_4_ = 0x80000000;
                auVar85 = vinsertps_avx(auVar231,ZEXT416((uint)(fVar182 * fVar193)),0x1c);
                auVar115 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar182 * fVar193 -
                                                       auVar145._0_4_ * fVar215)));
                auVar85 = vdivps_avx(auVar85,auVar115);
                auVar147 = vinsertps_avx(local_aa0._0_16_,auVar202,0x10);
                auVar147 = vdivps_avx(auVar147,auVar115);
                auVar115 = vmovsldup_avx(local_a80._0_16_);
                auVar91 = ZEXT416((uint)(fVar184 - auVar91._0_4_));
                auVar145 = vmovsldup_avx(auVar91);
                auVar150._0_4_ = auVar115._0_4_ * auVar85._0_4_ + auVar145._0_4_ * auVar147._0_4_;
                auVar150._4_4_ = auVar115._4_4_ * auVar85._4_4_ + auVar145._4_4_ * auVar147._4_4_;
                auVar150._8_4_ = auVar115._8_4_ * auVar85._8_4_ + auVar145._8_4_ * auVar147._8_4_;
                auVar150._12_4_ =
                     auVar115._12_4_ * auVar85._12_4_ + auVar145._12_4_ * auVar147._12_4_;
                auVar85 = vsubps_avx(auVar254,auVar150);
                auVar361 = ZEXT1664(auVar85);
                auVar151._8_4_ = 0x7fffffff;
                auVar151._0_8_ = 0x7fffffff7fffffff;
                auVar151._12_4_ = 0x7fffffff;
                auVar254 = vandps_avx(local_a80._0_16_,auVar151);
                auVar264 = ZEXT3264(local_980);
                fVar193 = (float)local_a40._0_4_;
                fVar182 = (float)local_a40._4_4_;
                fVar215 = fStack_a38;
                fVar184 = fStack_a34;
                fVar217 = fStack_a30;
                fVar186 = fStack_a2c;
                fVar219 = fStack_a28;
              } while (fVar299 <= auVar254._0_4_);
              auVar175._8_4_ = 0x7fffffff;
              auVar175._0_8_ = 0x7fffffff7fffffff;
              auVar175._12_4_ = 0x7fffffff;
              auVar254 = vandps_avx(auVar91,auVar175);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar79._0_4_ + fVar299 <=
                     auVar254._0_4_);
            fVar299 = auVar85._0_4_ + (float)local_8f0._0_4_;
            if ((fVar161 <= fVar299) &&
               (fVar300 = *(float *)(ray + k * 4 + 0x80), fVar299 <= fVar300)) {
              auVar254 = vmovshdup_avx(auVar85);
              fVar301 = auVar254._0_4_;
              if ((0.0 <= fVar301) && (fVar301 <= 1.0)) {
                auVar169 = vrsqrtss_avx(auVar169,auVar169);
                fVar158 = auVar169._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar74].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar169 = ZEXT416((uint)(fVar158 * 1.5 +
                                           fVar294 * -0.5 * fVar158 * fVar158 * fVar158));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar176._0_4_ = auVar169._0_4_ * (float)local_ae0._0_4_;
                  auVar176._4_4_ = auVar169._4_4_ * (float)local_ae0._4_4_;
                  auVar176._8_4_ = auVar169._8_4_ * fStack_ad8;
                  auVar176._12_4_ = auVar169._12_4_ * fStack_ad4;
                  auVar128._0_4_ = auVar256._0_4_ + auVar146._0_4_ * auVar176._0_4_;
                  auVar128._4_4_ = auVar256._4_4_ + auVar146._4_4_ * auVar176._4_4_;
                  auVar128._8_4_ = auVar256._8_4_ + auVar146._8_4_ * auVar176._8_4_;
                  auVar128._12_4_ = auVar256._12_4_ + auVar146._12_4_ * auVar176._12_4_;
                  auVar169 = vshufps_avx(auVar176,auVar176,0xc9);
                  auVar254 = vshufps_avx(auVar256,auVar256,0xc9);
                  auVar177._0_4_ = auVar254._0_4_ * auVar176._0_4_;
                  auVar177._4_4_ = auVar254._4_4_ * auVar176._4_4_;
                  auVar177._8_4_ = auVar254._8_4_ * auVar176._8_4_;
                  auVar177._12_4_ = auVar254._12_4_ * auVar176._12_4_;
                  auVar203._0_4_ = auVar256._0_4_ * auVar169._0_4_;
                  auVar203._4_4_ = auVar256._4_4_ * auVar169._4_4_;
                  auVar203._8_4_ = auVar256._8_4_ * auVar169._8_4_;
                  auVar203._12_4_ = auVar256._12_4_ * auVar169._12_4_;
                  auVar79 = vsubps_avx(auVar203,auVar177);
                  auVar169 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar254 = vshufps_avx(auVar128,auVar128,0xc9);
                  auVar204._0_4_ = auVar254._0_4_ * auVar169._0_4_;
                  auVar204._4_4_ = auVar254._4_4_ * auVar169._4_4_;
                  auVar204._8_4_ = auVar254._8_4_ * auVar169._8_4_;
                  auVar204._12_4_ = auVar254._12_4_ * auVar169._12_4_;
                  auVar169 = vshufps_avx(auVar79,auVar79,0xd2);
                  auVar129._0_4_ = auVar128._0_4_ * auVar169._0_4_;
                  auVar129._4_4_ = auVar128._4_4_ * auVar169._4_4_;
                  auVar129._8_4_ = auVar128._8_4_ * auVar169._8_4_;
                  auVar129._12_4_ = auVar128._12_4_ * auVar169._12_4_;
                  auVar169 = vsubps_avx(auVar204,auVar129);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar299;
                    uVar75 = vextractps_avx(auVar169,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar75;
                    uVar75 = vextractps_avx(auVar169,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar75;
                    *(int *)(ray + k * 4 + 0xe0) = auVar169._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar301;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar74;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar85,auVar85,0x55);
                    auVar254 = vshufps_avx(auVar169,auVar169,0x55);
                    auStack_750 = vshufps_avx(auVar169,auVar169,0xaa);
                    local_740 = vshufps_avx(auVar169,auVar169,0);
                    local_760 = (RTCHitN  [16])auVar254;
                    local_720 = ZEXT816(0) << 0x20;
                    local_710 = local_780._0_8_;
                    uStack_708 = local_780._8_8_;
                    local_700 = local_770;
                    vcmpps_avx(ZEXT1632(local_770),ZEXT1632(local_770),0xf);
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uVar76 = context->user->instPrimID[0];
                    auVar130._4_4_ = uVar76;
                    auVar130._0_4_ = uVar76;
                    auVar130._8_4_ = uVar76;
                    auVar130._12_4_ = uVar76;
                    auStack_6e0 = auVar130;
                    *(float *)(ray + k * 4 + 0x80) = fVar299;
                    local_8e0 = *local_a48;
                    local_b10.valid = (int *)local_8e0;
                    local_b10.geometryUserPtr = pGVar3->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_760;
                    local_b10.N = 4;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b10);
                      auVar264._8_56_ = extraout_var_00;
                      auVar264._0_8_ = extraout_XMM1_Qa_00;
                      auVar130 = auVar264._0_16_;
                      auVar264 = ZEXT3264(local_980);
                      auVar329 = ZEXT3264(local_ac0);
                    }
                    fVar193 = (float)local_a40._0_4_;
                    fVar182 = (float)local_a40._4_4_;
                    fVar215 = fStack_a38;
                    fVar184 = fStack_a34;
                    fVar217 = fStack_a30;
                    fVar186 = fStack_a2c;
                    fVar219 = fStack_a28;
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar169 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar254 = vpcmpeqd_avx(auVar130,auVar130);
                      auVar169 = auVar169 ^ auVar254;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      auVar254 = vpcmpeqd_avx(auVar254,auVar254);
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_b10);
                        auVar264 = ZEXT3264(local_980);
                        auVar329 = ZEXT3264(local_ac0);
                        auVar254 = vpcmpeqd_avx(auVar254,auVar254);
                        fVar193 = (float)local_a40._0_4_;
                        fVar182 = (float)local_a40._4_4_;
                        fVar215 = fStack_a38;
                        fVar184 = fStack_a34;
                        fVar217 = fStack_a30;
                        fVar186 = fStack_a2c;
                        fVar219 = fStack_a28;
                      }
                      auVar79 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar169 = auVar79 ^ auVar254;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar79 = auVar79 ^ auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar254;
                        auVar254 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                           (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar254;
                      }
                    }
                    auVar92._8_8_ = 0x100000001;
                    auVar92._0_8_ = 0x100000001;
                    if ((auVar92 & auVar169) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar300;
                    }
                  }
                }
              }
            }
LAB_007dd2d8:
            uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar298._4_4_ = uVar75;
            auVar298._0_4_ = uVar75;
            auVar298._8_4_ = uVar75;
            auVar298._12_4_ = uVar75;
            auVar298._16_4_ = uVar75;
            auVar298._20_4_ = uVar75;
            auVar298._24_4_ = uVar75;
            auVar298._28_4_ = uVar75;
            auVar361 = ZEXT3264(auVar298);
            auVar94 = vcmpps_avx(_local_800,auVar298,2);
          }
          auVar94 = vandps_avx(local_620,local_600);
          auVar258 = vandps_avx(local_840,_local_820);
          auVar156._0_4_ = (float)local_8a0._0_4_ + local_4c0._0_4_;
          auVar156._4_4_ = (float)local_8a0._4_4_ + local_4c0._4_4_;
          auVar156._8_4_ = fStack_898 + local_4c0._8_4_;
          auVar156._12_4_ = fStack_894 + local_4c0._12_4_;
          auVar156._16_4_ = fStack_890 + local_4c0._16_4_;
          auVar156._20_4_ = fStack_88c + local_4c0._20_4_;
          auVar156._24_4_ = fStack_888 + local_4c0._24_4_;
          auVar156._28_4_ = fStack_884 + local_4c0._28_4_;
          auVar169 = vshufps_avx(auVar361._0_16_,auVar361._0_16_,0);
          auVar213._16_16_ = auVar169;
          auVar213._0_16_ = auVar169;
          auVar95 = vcmpps_avx(auVar156,auVar213,2);
          auVar94 = vandps_avx(auVar95,auVar94);
          auVar241._0_4_ = (float)local_8a0._0_4_ + local_480._0_4_;
          auVar241._4_4_ = (float)local_8a0._4_4_ + local_480._4_4_;
          auVar241._8_4_ = fStack_898 + local_480._8_4_;
          auVar241._12_4_ = fStack_894 + local_480._12_4_;
          auVar241._16_4_ = fStack_890 + local_480._16_4_;
          auVar241._20_4_ = fStack_88c + local_480._20_4_;
          auVar241._24_4_ = fStack_888 + local_480._24_4_;
          auVar241._28_4_ = fStack_884 + local_480._28_4_;
          auVar95 = vcmpps_avx(auVar241,auVar213,2);
          auVar258 = vandps_avx(auVar95,auVar258);
          auVar258 = vorps_avx(auVar94,auVar258);
          if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar258 >> 0x7f,0) != '\0') ||
                (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar258 >> 0xbf,0) != '\0') ||
              (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar258[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar70 * 0x60) = auVar258;
            auVar94 = vblendvps_avx(_local_480,_local_4c0,auVar94);
            *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x60) = auVar94;
            uVar72 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar70 * 0xc] = uVar72;
            auStack_138[uVar70 * 0x18] = local_c48 + 1;
            uVar70 = (ulong)((int)uVar70 + 1);
          }
          auVar361 = ZEXT3264(local_940);
          fVar251 = (float)local_8a0._0_4_;
          fVar267 = (float)local_8a0._4_4_;
          fVar270 = fStack_898;
          fVar273 = fStack_894;
          fVar276 = fStack_890;
          fVar279 = fStack_88c;
          fVar282 = fStack_888;
          fVar302 = fStack_884;
          goto LAB_007dbd57;
        }
      }
      auVar361 = ZEXT3264(local_940);
      auVar329 = ZEXT3264(local_ac0);
      auVar264 = ZEXT3264(local_980);
    }
LAB_007dbd57:
    while( true ) {
      auVar258 = local_580;
      uVar76 = (uint)uVar70;
      if (uVar76 == 0) {
        uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar93._4_4_ = uVar75;
        auVar93._0_4_ = uVar75;
        auVar93._8_4_ = uVar75;
        auVar93._12_4_ = uVar75;
        auVar169 = vcmpps_avx(local_5e0,auVar93,2);
        uVar74 = vmovmskps_avx(auVar169);
        uVar69 = (ulong)((uint)uVar69 - 1 & (uint)uVar69 & uVar74);
        goto LAB_007dac5d;
      }
      uVar70 = (ulong)(uVar76 - 1);
      lVar71 = uVar70 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar71);
      auVar100._0_4_ = fVar251 + auVar94._0_4_;
      auVar100._4_4_ = fVar267 + auVar94._4_4_;
      auVar100._8_4_ = fVar270 + auVar94._8_4_;
      auVar100._12_4_ = fVar273 + auVar94._12_4_;
      auVar100._16_4_ = fVar276 + auVar94._16_4_;
      auVar100._20_4_ = fVar279 + auVar94._20_4_;
      auVar100._24_4_ = fVar282 + auVar94._24_4_;
      auVar100._28_4_ = fVar302 + auVar94._28_4_;
      uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar180._4_4_ = uVar75;
      auVar180._0_4_ = uVar75;
      auVar180._8_4_ = uVar75;
      auVar180._12_4_ = uVar75;
      auVar180._16_4_ = uVar75;
      auVar180._20_4_ = uVar75;
      auVar180._24_4_ = uVar75;
      auVar180._28_4_ = uVar75;
      auVar131 = vcmpps_avx(auVar100,auVar180,2);
      auVar95 = vandps_avx(auVar131,*(undefined1 (*) [32])(auStack_180 + lVar71));
      _local_760 = auVar95;
      auVar131 = *(undefined1 (*) [32])(auStack_180 + lVar71) & auVar131;
      if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar131 >> 0x7f,0) != '\0') ||
            (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar131 >> 0xbf,0) != '\0') ||
          (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar131[0x1f] < '\0') break;
      uVar70 = (ulong)(uVar76 - 1);
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar94 = vblendvps_avx(auVar154,auVar94,auVar95);
    auVar131 = vshufps_avx(auVar94,auVar94,0xb1);
    auVar131 = vminps_avx(auVar94,auVar131);
    auVar289 = vshufpd_avx(auVar131,auVar131,5);
    auVar131 = vminps_avx(auVar131,auVar289);
    auVar289 = vperm2f128_avx(auVar131,auVar131,1);
    auVar131 = vminps_avx(auVar131,auVar289);
    auVar94 = vcmpps_avx(auVar94,auVar131,0);
    auVar131 = auVar95 & auVar94;
    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar131 >> 0x7f,0) != '\0') ||
          (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar131 >> 0xbf,0) != '\0') ||
        (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar131[0x1f] < '\0') {
      auVar95 = vandps_avx(auVar94,auVar95);
    }
    auVar118._8_8_ = 0;
    auVar118._0_8_ = (&uStack_140)[uVar70 * 0xc];
    local_c48 = auStack_138[uVar70 * 0x18];
    uVar73 = vmovmskps_avx(auVar95);
    uVar68 = 0;
    if (uVar73 != 0) {
      for (; (uVar73 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar68 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar71) = _local_760;
    uVar73 = uVar76 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar73 = uVar76;
    }
    auVar169 = vshufps_avx(auVar118,auVar118,0);
    auVar254 = vshufps_avx(auVar118,auVar118,0x55);
    auVar254 = vsubps_avx(auVar254,auVar169);
    local_4c0._4_4_ = auVar169._4_4_ + auVar254._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar169._0_4_ + auVar254._0_4_ * 0.0;
    fStack_4b8 = auVar169._8_4_ + auVar254._8_4_ * 0.2857143;
    fStack_4b4 = auVar169._12_4_ + auVar254._12_4_ * 0.42857146;
    fStack_4b0 = auVar169._0_4_ + auVar254._0_4_ * 0.5714286;
    fStack_4ac = auVar169._4_4_ + auVar254._4_4_ * 0.71428573;
    fStack_4a8 = auVar169._8_4_ + auVar254._8_4_ * 0.8571429;
    fStack_4a4 = auVar169._12_4_ + auVar254._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar68 * 4);
    uVar70 = (ulong)uVar73;
    auVar289 = auVar329._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }